

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase64::run(TestCase64 *this)

{
  undefined1 *value;
  anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 *this_00;
  bool bVar1;
  int *piVar2;
  Maybe<int> *pMVar3;
  NullableValue<int> *pNVar4;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *pOVar5;
  CopyOrMove *pCVar6;
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *pMVar7;
  Maybe<int_&> *pMVar8;
  Maybe<const_int_&> *pMVar9;
  int **ppiVar10;
  Maybe<kj::String> *pMVar11;
  String *pSVar12;
  Maybe<kj::(anonymous_namespace)::ImplicitToInt> *other;
  uint *puVar13;
  Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *other_00;
  CopyOrMove **ppCVar14;
  char (*params) [4];
  bool local_1f29;
  int local_1f28;
  bool _kj_shouldLog_108;
  Maybe<IntWrapper> local_1f1c;
  int local_1f14 [2];
  DebugExpression<int> local_1f0c;
  undefined1 local_1f08 [8];
  DebugComparison<int,_int> _kjCondition_106;
  IntWrapper local_1ee0;
  bool _kj_shouldLog_107;
  int local_1ed4 [2];
  DebugExpression<int> local_1ecc;
  undefined1 local_1ec8 [8];
  DebugComparison<int,_int> _kjCondition_105;
  IntWrapper local_1ea0;
  bool _kj_shouldLog_106;
  int local_1e94 [2];
  DebugExpression<int> local_1e8c;
  undefined1 local_1e88 [8];
  DebugComparison<int,_int> _kjCondition_104;
  DebugExpression<kj::Maybe<int>_&> DStack_1e60;
  bool _kj_shouldLog_105;
  undefined1 local_1e58 [8];
  DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> _kjCondition_103;
  DebugExpression<kj::Maybe<int>_&> DStack_1e28;
  bool _kj_shouldLog_104;
  undefined1 local_1e20 [8];
  DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> _kjCondition_102;
  DebugExpression<kj::Maybe<int>_&> DStack_1df0;
  bool _kj_shouldLog_103;
  undefined1 local_1de8 [8];
  DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> _kjCondition_101;
  DebugExpression<kj::Maybe<int>_&> DStack_1db8;
  bool _kj_shouldLog_102;
  undefined1 local_1db0 [8];
  DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> _kjCondition_100;
  DebugExpression<kj::Maybe<int>_&> DStack_1d80;
  bool _kj_shouldLog_101;
  undefined1 local_1d78 [8];
  DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> _kjCondition_99;
  Maybe<int> m5;
  Maybe<int> m4;
  Maybe<int> m3_1;
  Maybe<int> m2_3;
  Maybe<int> m1;
  bool _kj_shouldLog_100;
  undefined1 local_1d08 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_98;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1cd8;
  bool _kj_shouldLog_99;
  undefined1 local_1cd0 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_97;
  Maybe<int_&> n_3;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1c98;
  bool _kj_shouldLog_98;
  undefined1 local_1c90 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_96;
  Maybe<int_&> m_20;
  int x_2;
  bool _kj_shouldLog_97;
  undefined1 local_1c50 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_95;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1c20;
  bool _kj_shouldLog_96;
  undefined1 local_1c18 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_94;
  Maybe<int> n_2;
  bool _kj_shouldLog_95;
  undefined1 local_1bd8 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_93;
  Maybe<int_&> m_19;
  int x_1;
  bool _kj_shouldLog_94;
  undefined1 local_1b98 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_92;
  DebugExpression<kj::Maybe<int>_&> DStack_1b68;
  bool _kj_shouldLog_93;
  undefined1 local_1b60 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_91;
  Maybe<int> n_1;
  bool _kj_shouldLog_92;
  undefined1 local_1b20 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_90;
  Maybe<int> m_18;
  bool _kj_shouldLog_91;
  undefined1 local_1ae0 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_89;
  DebugExpression<kj::Maybe<int>_&> DStack_1ab0;
  bool _kj_shouldLog_90;
  undefined1 local_1aa8 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_88;
  Maybe<int> n;
  bool _kj_shouldLog_89;
  undefined1 local_1a68 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_87;
  Maybe<int> local_1a38;
  Maybe<int> m_17;
  bool _kj_shouldLog_88;
  Fault local_1a20;
  CopyOrMove *local_1a18;
  CopyOrMove *_kj_result_8;
  undefined1 local_1a08 [8];
  DebugComparison<int_&,_int> _kjCondition_86;
  bool _kj_shouldLog_87;
  DebugExpression<int_&> DStack_19d8;
  undefined1 local_19d0 [8];
  DebugComparison<int_&,_int> _kjCondition_85;
  DebugExpression<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove_&>_&> DStack_19a0;
  bool _kj_shouldLog_86;
  undefined1 local_1998 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove_&>_&,_const_kj::None_&>
  _kjCondition_84;
  Maybe<kj::(anonymous_namespace)::CopyOrMove> m2_2;
  Maybe<kj::(anonymous_namespace)::CopyOrMove_&> m_16;
  CopyOrMove x;
  bool _kj_shouldLog_85;
  undefined1 local_1950 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
  _kjCondition_83;
  DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&> DStack_1920;
  bool _kj_shouldLog_84;
  undefined1 local_1918 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
  _kjCondition_82;
  DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&> DStack_18e8;
  bool _kj_shouldLog_83;
  undefined1 local_18e0 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
  _kjCondition_81;
  undefined1 local_18b0 [6];
  Maybe<kj::(anonymous_namespace)::Immovable> m_15;
  int local_1898;
  bool local_1891;
  int local_1890;
  DebugExpression<int> DStack_188c;
  bool _kj_shouldLog_82;
  undefined1 local_1888 [8];
  DebugComparison<int,_unsigned_int_&> _kjCondition_80;
  uint *v_26;
  uint *_v352;
  int local_1838;
  bool local_1831;
  int local_1830;
  DebugExpression<int> DStack_182c;
  bool _kj_shouldLog_81;
  undefined1 local_1828 [8];
  DebugComparison<int,_unsigned_int_&> _kjCondition_79;
  uint *v_25;
  uint *_v347;
  Maybe<unsigned_int> m3;
  Maybe<unsigned_int> m2_1;
  Maybe<kj::(anonymous_namespace)::ImplicitToInt> m_14;
  bool local_17b2;
  anon_class_1_0_00000001 local_17b1;
  undefined1 local_17b0 [6];
  bool _kj_shouldLog_80;
  char (*local_1798) [4];
  undefined1 local_1790 [8];
  DebugComparison<const_char_(&)[4],_kj::String> _kjCondition_78;
  DebugExpression<const_char_(&)[4]> DStack_1750;
  bool _kj_shouldLog_79;
  undefined1 local_1748 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition_77;
  undefined1 local_1708 [8];
  String s;
  undefined1 local_16e8 [8];
  Maybe<kj::String> m_13;
  bool _kj_shouldLog_78;
  int *v_24;
  int *_v327;
  DebugExpression<kj::Maybe<const_int_&>_&> DStack_16a8;
  bool _kj_shouldLog_77;
  undefined1 local_16a0 [8];
  DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> _kjCondition_76;
  Maybe<const_int_&> m_12;
  Maybe<int> local_1668;
  Maybe<int> mi_3;
  bool local_1655;
  int local_1654;
  int iStack_1650;
  bool _kj_shouldLog_76;
  DebugExpression<int> local_164c;
  undefined1 local_1648 [8];
  DebugComparison<int,_const_int_&> _kjCondition_75;
  int *local_1608;
  int *local_1600;
  Fault local_15f8;
  int *local_15f0;
  int *_kj_result_7;
  bool local_15d9;
  int *piStack_15d8;
  bool _kj_shouldLog_75;
  int *local_15d0;
  Fault local_15c8;
  int *local_15c0;
  int *_kj_result_6;
  int *local_15b0;
  undefined1 local_15a8 [8];
  DebugComparison<const_int_*,_const_int_*> _kjCondition_74;
  int *v_23;
  int *_v315;
  int *local_1558;
  int *local_1550;
  Fault local_1548;
  int *local_1540;
  int *_kj_result_5;
  bool local_1529;
  int *piStack_1528;
  bool _kj_shouldLog_74;
  int *local_1520;
  Fault local_1518;
  int *local_1510;
  int *_kj_result_4;
  int *local_1500;
  undefined1 local_14f8 [8];
  DebugComparison<const_int_*,_const_int_*> _kjCondition_73;
  int *v_22;
  int *_v310;
  DebugExpression<kj::Maybe<const_int_&>_&> DStack_14b8;
  bool _kj_shouldLog_73;
  undefined1 local_14b0 [8];
  DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> _kjCondition_72;
  bool _kj_shouldLog_72;
  DebugExpression<bool> _kjCondition_71;
  Maybe<const_int_&> m_11;
  Maybe<int> mi_2;
  bool _kj_shouldLog_71;
  int *v_21;
  int *_v300;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1450;
  bool _kj_shouldLog_70;
  undefined1 local_1448 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_70;
  Maybe<int_&> m_10;
  Maybe<int> local_1410;
  Maybe<int> mi_1;
  bool local_13fd;
  int local_13fc;
  int iStack_13f8;
  bool _kj_shouldLog_69;
  DebugExpression<int> local_13f4;
  undefined1 local_13f0 [8];
  DebugComparison<int,_const_int_&> _kjCondition_69;
  int *local_13b0;
  int *local_13a8;
  Fault local_13a0;
  int *local_1398;
  int *_kj_result_3;
  bool local_1381;
  int *piStack_1380;
  bool _kj_shouldLog_68;
  int *local_1378;
  Fault local_1370;
  int *local_1368;
  int *_kj_result_2;
  int *local_1358;
  undefined1 local_1350 [8];
  DebugComparison<int_*,_int_*> _kjCondition_68;
  int *v_20;
  int *_v288;
  int *local_1300;
  int *local_12f8;
  Fault local_12f0;
  int *local_12e8;
  int *_kj_result_1;
  bool local_12d1;
  int *piStack_12d0;
  bool _kj_shouldLog_67;
  int *local_12c8;
  Fault local_12c0;
  int *local_12b8;
  int *_kj_result;
  int *local_12a8;
  undefined1 local_12a0 [8];
  DebugComparison<int_*,_int_*> _kjCondition_67;
  int *v_19;
  int *_v283;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1260;
  bool _kj_shouldLog_66;
  undefined1 local_1258 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_66;
  bool _kj_shouldLog_65;
  DebugExpression<bool> _kjCondition_65;
  Maybe<int_&> m_9;
  Maybe<int> mi;
  bool local_120d;
  int local_120c;
  int iStack_1208;
  bool _kj_shouldLog_64;
  DebugExpression<int> local_1204;
  undefined1 local_1200 [8];
  DebugComparison<int,_const_int_&> _kjCondition_64;
  int local_11d0;
  DebugExpression<int> DStack_11cc;
  bool _kj_shouldLog_63;
  undefined1 local_11c8 [8];
  DebugComparison<int,_int_&> _kjCondition_63;
  int *v_18;
  int *_v271;
  int local_1170;
  DebugExpression<int> DStack_116c;
  bool _kj_shouldLog_62;
  undefined1 local_1168 [8];
  DebugComparison<int,_int_&> _kjCondition_62;
  int *v_17;
  int *_v267;
  bool _kj_shouldLog_61;
  DebugExpression<bool> _kjCondition_61;
  DebugExpression<kj::Maybe<int_&>_&> DStack_1110;
  bool _kj_shouldLog_60;
  undefined1 local_1108 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_60;
  Maybe<int_&> local_10d8;
  Maybe<int_&> m_8;
  bool local_10c5;
  int local_10c4;
  int iStack_10c0;
  bool _kj_shouldLog_59;
  DebugExpression<int> local_10bc;
  undefined1 local_10b8 [8];
  DebugComparison<int,_const_int_&> _kjCondition_59;
  int *local_1078;
  Maybe<int_&> *local_1070;
  bool local_1061;
  int *piStack_1060;
  bool _kj_shouldLog_58;
  Maybe<int_&> *local_1058;
  int *local_1050;
  undefined1 local_1048 [8];
  DebugComparison<int_*,_const_int_*> _kjCondition_58;
  int *v_16;
  int *_v255;
  int *local_ff8;
  Maybe<int_&> *local_ff0;
  bool local_fe1;
  int *piStack_fe0;
  bool _kj_shouldLog_57;
  Maybe<int_&> *local_fd8;
  int *local_fd0;
  undefined1 local_fc8 [8];
  DebugComparison<int_*,_const_int_*> _kjCondition_57;
  int *v_15;
  int *_v250;
  DebugExpression<kj::Maybe<const_int_&>_&> DStack_f88;
  bool _kj_shouldLog_56;
  undefined1 local_f80 [8];
  DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> _kjCondition_56;
  bool _kj_shouldLog_55;
  DebugExpression<bool> _kjCondition_55;
  Maybe<const_int_&> m_7;
  Maybe<int_&> m2;
  bool local_f35;
  int local_f34;
  int iStack_f30;
  bool _kj_shouldLog_54;
  DebugExpression<int> local_f2c;
  undefined1 local_f28 [8];
  DebugComparison<int,_const_int_&> _kjCondition_54;
  int *local_ee8;
  Maybe<int_&> *local_ee0;
  bool local_ed1;
  int *piStack_ed0;
  bool _kj_shouldLog_53;
  Maybe<int_&> *local_ec8;
  int *local_ec0;
  undefined1 local_eb8 [8];
  DebugComparison<int_*,_int_*> _kjCondition_53;
  int *v_14;
  int *_v237;
  int *local_e68;
  Maybe<int_&> *local_e60;
  bool local_e51;
  int *piStack_e50;
  bool _kj_shouldLog_52;
  Maybe<int_&> *local_e48;
  int *local_e40;
  undefined1 local_e38 [8];
  DebugComparison<int_*,_int_*> _kjCondition_52;
  int *v_13;
  int *_v232;
  DebugExpression<kj::Maybe<int_&>_&> DStack_df8;
  bool _kj_shouldLog_51;
  undefined1 local_df0 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_51;
  bool _kj_shouldLog_50;
  DebugExpression<bool> _kjCondition_50;
  Maybe<int_&> m_6;
  bool local_dad;
  int local_dac;
  int iStack_da8;
  bool _kj_shouldLog_49;
  DebugExpression<int> local_da4;
  undefined1 local_da0 [8];
  DebugComparison<int,_const_int_&> _kjCondition_49;
  int local_d70;
  DebugExpression<int> DStack_d6c;
  bool _kj_shouldLog_48;
  undefined1 local_d68 [8];
  DebugComparison<int,_int_&> _kjCondition_48;
  int *v_12;
  int *_v221;
  int local_d10;
  DebugExpression<int> DStack_d0c;
  bool _kj_shouldLog_47;
  undefined1 local_d08 [8];
  DebugComparison<int,_int_&> _kjCondition_47;
  int *v_11;
  int *_v217;
  bool _kj_shouldLog_46;
  DebugExpression<bool> _kjCondition_46;
  DebugExpression<kj::Maybe<int_&>_&> DStack_cb0;
  bool _kj_shouldLog_45;
  undefined1 local_ca8 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_45;
  Maybe<int_&> local_c78;
  Maybe<int_&> m_5;
  bool local_c65;
  int local_c64;
  int iStack_c60;
  bool _kj_shouldLog_44;
  DebugExpression<int> local_c5c;
  undefined1 local_c58 [8];
  DebugComparison<int,_const_int_&> _kjCondition_44;
  int *local_c18;
  Maybe<int_&> *local_c10;
  bool local_c01;
  int *piStack_c00;
  bool _kj_shouldLog_43;
  Maybe<int_&> *local_bf8;
  int *local_bf0;
  undefined1 local_be8 [8];
  DebugComparison<int_*,_int_*> _kjCondition_43;
  int *v_10;
  int *_v205;
  int *local_b98;
  Maybe<int_&> *local_b90;
  bool local_b81;
  int *piStack_b80;
  bool _kj_shouldLog_42;
  Maybe<int_&> *local_b78;
  int *local_b70;
  undefined1 local_b68 [8];
  DebugComparison<int_*,_int_*> _kjCondition_42;
  int *v_9;
  int *_v200;
  DebugExpression<kj::Maybe<int_&>_&> DStack_b28;
  bool _kj_shouldLog_41;
  undefined1 local_b20 [8];
  DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> _kjCondition_41;
  bool _kj_shouldLog_40;
  DebugExpression<bool> _kjCondition_40;
  Maybe<int_&> m_4;
  int i;
  bool _kj_shouldLog_39;
  DebugExpression<bool_&> _kjCondition_39;
  int local_acc [2];
  bool local_ac1;
  anon_class_8_1_bd98cb13 aStack_ac0;
  bool _kj_shouldLog_38;
  int local_ab4 [2];
  DebugExpression<int> local_aac;
  undefined1 local_aa8 [8];
  DebugComparison<int,_int> _kjCondition_38;
  int local_a80;
  int iStack_a7c;
  bool ranLazy_3;
  bool local_a75;
  int local_a74;
  int iStack_a70;
  bool _kj_shouldLog_37;
  DebugExpression<int> local_a6c;
  undefined1 local_a68 [8];
  DebugComparison<int,_const_int_&> _kjCondition_37;
  int local_a38;
  DebugExpression<int> DStack_a34;
  bool _kj_shouldLog_36;
  undefined1 local_a30 [8];
  DebugComparison<int,_int_&> _kjCondition_36;
  int *v_8;
  NullableValue<int> _v182;
  int local_9d8;
  DebugExpression<int> DStack_9d4;
  bool _kj_shouldLog_35;
  undefined1 local_9d0 [8];
  DebugComparison<int,_int_&> _kjCondition_35;
  int *v_7;
  int *_v178;
  bool _kj_shouldLog_34;
  DebugExpression<bool> _kjCondition_34;
  DebugExpression<kj::Maybe<int>_&> DStack_978;
  bool _kj_shouldLog_33;
  undefined1 local_970 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_33;
  Maybe<int> m_3;
  bool _kj_shouldLog_32;
  DebugExpression<bool> _kjCondition_32;
  int local_92c [2];
  bool local_921;
  anon_class_8_1_bd98cb13 aStack_920;
  bool _kj_shouldLog_31;
  int local_914 [2];
  DebugExpression<int> local_90c;
  undefined1 local_908 [8];
  DebugComparison<int,_int> _kjCondition_31;
  int local_8e0;
  int iStack_8dc;
  bool ranLazy_2;
  bool local_8d5;
  int local_8d4;
  int iStack_8d0;
  bool _kj_shouldLog_30;
  DebugExpression<int> local_8cc;
  undefined1 local_8c8 [8];
  DebugComparison<int,_const_int_&> _kjCondition_30;
  int local_888;
  bool local_881;
  int local_880;
  DebugExpression<int> DStack_87c;
  bool _kj_shouldLog_29;
  undefined1 local_878 [8];
  DebugComparison<int,_int_&> _kjCondition_29;
  int *v_6;
  NullableValue<int> _v160;
  int local_828;
  bool local_821;
  int local_820;
  DebugExpression<int> DStack_81c;
  bool _kj_shouldLog_28;
  undefined1 local_818 [8];
  DebugComparison<int,_int_&> _kjCondition_28;
  int *v_5;
  int *_v155;
  DebugExpression<kj::Maybe<int>_&> DStack_7d8;
  bool _kj_shouldLog_27;
  undefined1 local_7d0 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_27;
  bool _kj_shouldLog_26;
  DebugExpression<bool> _kjCondition_26;
  Maybe<int> m_2;
  int *local_790;
  bool local_781;
  int **ppiStack_780;
  bool _kj_shouldLog_25;
  int *local_778;
  int *local_770;
  undefined1 local_768 [8];
  DebugComparison<int_*,_int_*> _kjCondition_25;
  int local_734;
  int **ppiStack_730;
  int ref2_1;
  int *local_728;
  bool local_719;
  int **ppiStack_718;
  bool _kj_shouldLog_24;
  int *local_710;
  int *local_708;
  undefined1 local_700 [8];
  DebugComparison<int_*,_int_*> _kjCondition_24;
  int *ref1;
  int defaultValue;
  Maybe<int> empty;
  bool _kj_shouldLog_23;
  undefined1 local_6b0 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_23;
  bool _kj_shouldLog_22;
  DebugExpression<bool> _kjCondition_22;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_678;
  int local_668;
  bool local_661;
  undefined1 *puStack_660;
  bool _kj_shouldLog_21;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_658;
  int local_648;
  DebugExpression<int> local_644;
  undefined1 local_640 [8];
  DebugComparison<int,_int_&> _kjCondition_21;
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&>
  DStack_610;
  bool _kj_shouldLog_20;
  undefined1 local_608 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_20;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_5d8;
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> local_5c8;
  bool local_5b1;
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&>
  DStack_5b0;
  bool _kj_shouldLog_19;
  undefined1 local_5a8 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_19;
  DebugExpression<bool_&> DStack_578;
  bool _kj_shouldLog_18;
  DebugExpression<bool_&> _kjCondition_18;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_568;
  int local_558;
  bool local_551;
  undefined1 *puStack_550;
  bool _kj_shouldLog_17;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_548;
  int local_538;
  DebugExpression<int> local_534;
  undefined1 local_530 [8];
  DebugComparison<int,_int_&> _kjCondition_17;
  bool ranLazy_1;
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&>
  DStack_500;
  bool _kj_shouldLog_16;
  undefined1 local_4f8 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_16;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> local_4c8;
  int local_4b4;
  bool local_4ad;
  int local_4ac;
  undefined1 local_4a8 [3];
  bool _kj_shouldLog_15;
  int local_498;
  DebugExpression<int> local_494;
  undefined1 local_490 [8];
  DebugComparison<int,_const_int_&> _kjCondition_15;
  int local_450;
  bool local_449;
  int local_448;
  DebugExpression<int> DStack_444;
  bool _kj_shouldLog_14;
  undefined1 local_440 [8];
  DebugComparison<int,_int_&> _kjCondition_14;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *v_4;
  OwnOwn<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> _v111;
  int local_3e8;
  bool local_3e1;
  int local_3e0;
  DebugExpression<int> DStack_3dc;
  bool _kj_shouldLog_13;
  undefined1 local_3d8 [8];
  DebugComparison<int,_int_&> _kjCondition_13;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *v_3;
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *_v106;
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&>
  DStack_398;
  bool _kj_shouldLog_12;
  undefined1 local_390 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition_12;
  bool _kj_shouldLog_11;
  DebugExpression<bool> _kjCondition_11;
  undefined1 local_350 [8];
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> m_1;
  int local_324;
  bool local_31d;
  int local_31c;
  bool _kj_shouldLog_10;
  DebugExpression<const_int_&> DStack_318;
  undefined1 local_310 [8];
  DebugComparison<const_int_&,_int> _kjCondition_10;
  int *local_2e0;
  bool local_2d1;
  int *piStack_2d0;
  bool _kj_shouldLog_9;
  int *local_2c8;
  int *local_2c0;
  undefined1 local_2b8 [8];
  DebugComparison<const_int_*,_const_int_*> _kjCondition_9;
  int *ref2;
  int *local_278;
  bool local_269;
  int *piStack_268;
  bool _kj_shouldLog_8;
  int *local_260;
  int *local_258;
  undefined1 local_250 [8];
  DebugComparison<const_int_*,_int_*> _kjCondition_8;
  DebugExpression<const_int_&> DStack_220;
  bool _kj_shouldLog_7;
  undefined1 local_218 [8];
  DebugComparison<const_int_&,_int_&> _kjCondition_7;
  int *ref;
  int *piStack_1d8;
  int notUsedForRef;
  int *v_2;
  int *_v87;
  bool _kj_shouldLog_6;
  anon_class_8_1_bd98cb13 aStack_1c0;
  DebugExpression<bool> _kjCondition_6;
  int local_1b4 [2];
  bool local_1a9;
  anon_class_8_1_bd98cb13 aStack_1a8;
  bool _kj_shouldLog_5;
  int local_19c [2];
  DebugExpression<int> local_194;
  undefined1 local_190 [8];
  DebugComparison<int,_int> _kjCondition_5;
  int local_168;
  int iStack_164;
  bool ranLazy;
  bool local_15d;
  int local_15c;
  int iStack_158;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_154;
  undefined1 local_150 [8];
  DebugComparison<int,_const_int_&> _kjCondition_4;
  int local_110;
  bool local_109;
  int local_108;
  DebugExpression<int> DStack_104;
  bool _kj_shouldLog_3;
  undefined1 local_100 [8];
  DebugComparison<int,_int_&> _kjCondition_3;
  int *v_1;
  NullableValue<int> _v74;
  int local_b0;
  bool local_a9;
  int local_a8;
  DebugExpression<int> DStack_a4;
  bool _kj_shouldLog_2;
  undefined1 local_a0 [8];
  DebugComparison<int,_int_&> _kjCondition_2;
  int *v;
  int *_v69;
  DebugExpression<kj::Maybe<int>_&> DStack_60;
  bool _kj_shouldLog_1;
  undefined1 local_58 [8];
  DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> _kjCondition_1;
  bool _kj_shouldLog;
  bool local_1e;
  DebugExpression<bool> local_1d;
  int local_1c;
  DebugExpression<bool> _kjCondition;
  Maybe<int> m;
  TestCase64 *this_local;
  
  local_1c = 0x7b;
  Maybe<int>::Maybe((Maybe<int> *)&stack0xffffffffffffffe8,&local_1c);
  bVar1 = Maybe<int>::operator==((Maybe<int> *)&stack0xffffffffffffffe8);
  local_1e = (bool)(~bVar1 & 1);
  local_1d = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_1d);
  if (!bVar1) {
    _kjCondition_1._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x43,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",&local_1d);
      _kjCondition_1._35_1_ = 0;
    }
  }
  DStack_60 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (Maybe<int> *)&stack0xffffffffffffffe8);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_58,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffffa0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    _v69._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v69._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x44,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_58);
      _v69._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int> *)&stack0xffffffffffffffe8);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v74,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x48);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v74);
  }
  else {
    local_a8 = 0x7b;
    _kjCondition_2._32_8_ = piVar2;
    DStack_a4 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a8);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_a0,&stack0xffffffffffffff5c,
               (int *)_kjCondition_2._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (!bVar1) {
      local_a9 = kj::_::Debug::shouldLog(ERROR);
      while (local_a9 != false) {
        local_b0 = 0x7b;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x46,ERROR,"\"failed: expected \" \"(123) == (v)\", _kjCondition, 123, v",
                   (char (*) [30])"failed: expected (123) == (v)",
                   (DebugComparison<int,_int_&> *)local_a0,&local_b0,(int *)_kjCondition_2._32_8_);
        local_a9 = false;
      }
    }
  }
  pMVar3 = mv<kj::Maybe<int>>((Maybe<int> *)&stack0xffffffffffffffe8);
  pNVar4 = kj::_::readMaybe<int>(pMVar3);
  kj::_::NullableValue<int>::NullableValue((NullableValue<int> *)&v_1,pNVar4);
  piVar2 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&v_1);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_4.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x4d);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_4.result);
  }
  else {
    _kjCondition_3._32_8_ = kj::_::NullableValue<int>::operator*((NullableValue<int> *)&v_1);
    local_108 = 0x7b;
    DStack_104 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_108);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_100,&stack0xfffffffffffffefc,
               (int *)_kjCondition_3._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_100);
    if (!bVar1) {
      local_109 = kj::_::Debug::shouldLog(ERROR);
      while (local_109 != false) {
        local_110 = 0x7b;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x4b,ERROR,"\"failed: expected \" \"(123) == (v)\", _kjCondition, 123, v",
                   (char (*) [30])"failed: expected (123) == (v)",
                   (DebugComparison<int,_int_&> *)local_100,&local_110,(int *)_kjCondition_3._32_8_)
        ;
        local_109 = false;
      }
    }
  }
  kj::_::NullableValue<int>::~NullableValue((NullableValue<int> *)&v_1);
  iStack_158 = 0x7b;
  local_154 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffea8);
  local_15c = 0x1c8;
  piVar2 = Maybe<int>::orDefault((Maybe<int> *)&stack0xffffffffffffffe8,&local_15c);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_150,&local_154,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
  if (!bVar1) {
    local_15d = kj::_::Debug::shouldLog(ERROR);
    while (local_15d != false) {
      iStack_164 = 0x7b;
      local_168 = 0x1c8;
      piVar2 = Maybe<int>::orDefault((Maybe<int> *)&stack0xffffffffffffffe8,&local_168);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x4f,ERROR,
                 "\"failed: expected \" \"(123) == (m.orDefault(456))\", _kjCondition, 123, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (123) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_150,&stack0xfffffffffffffe9c,piVar2);
      local_15d = false;
    }
  }
  _kjCondition_5._31_1_ = 0;
  local_19c[1] = 0x7b;
  local_194 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_19c + 1);
  aStack_1a8.ranLazy = (bool *)&_kjCondition_5.field_0x1f;
  local_19c[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__0,int>
                           ((Maybe<int> *)&stack0xffffffffffffffe8,&stack0xfffffffffffffe58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_190,&local_194,local_19c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_1a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      local_1b4[1] = 0x7b;
      aStack_1c0.ranLazy = (bool *)&_kjCondition_5.field_0x1f;
      local_1b4[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__1,int>
                               ((Maybe<int> *)&stack0xffffffffffffffe8,&stack0xfffffffffffffe40);
      kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x54,ERROR,
                 "\"failed: expected \" \"(123) == (m.orDefault([&] { ranLazy = true; return 456; }))\", _kjCondition, 123, m.orDefault([&] { ranLazy = true; return 456; })"
                 ,(char (*) [77])
                  "failed: expected (123) == (m.orDefault([&] { ranLazy = true; return 456; }))",
                 (DebugComparison<int,_int> *)local_190,local_1b4 + 1,local_1b4);
      local_1a9 = false;
    }
  }
  _v87._6_1_ = ~_kjCondition_5._31_1_ & 1;
  _v87._7_1_ = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&_v87 + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&_v87 + 7));
  if (!bVar1) {
    _v87._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v87._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"!(ranLazy)\", _kjCondition",
                 (char (*) [28])"failed: expected !(ranLazy)",
                 (DebugExpression<bool> *)((long)&_v87 + 7));
      _v87._5_1_ = false;
    }
  }
  v_2 = kj::_::readMaybe<int>((Maybe<int> *)&stack0xffffffffffffffe8);
  if (v_2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&m_1.ptr.ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x62);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&m_1.ptr.ptr);
  }
  else {
    ref._4_4_ = 5;
    _kjCondition_7._32_8_ = (long)&ref + 4;
    piStack_1d8 = v_2;
    piVar2 = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__2,int&>
                       ((Maybe<int> *)&stack0xffffffffffffffe8,
                        (anon_class_8_1_159ea27a *)&_kjCondition_7.result);
    DStack_220 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,piVar2);
    kj::_::DebugExpression<int_const&>::operator==
              ((DebugComparison<const_int_&,_int_&> *)local_218,
               (DebugExpression<int_const&> *)&stack0xfffffffffffffde0,piStack_1d8);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
    if (!bVar1) {
      _kjCondition_8._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_8._39_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[30],kj::_::DebugComparison<int_const&,int&>&,int_const&,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x5b,ERROR,"\"failed: expected \" \"(ref) == (v)\", _kjCondition, ref, v",
                   (char (*) [30])"failed: expected (ref) == (v)",
                   (DebugComparison<const_int_&,_int_&> *)local_218,piVar2,piStack_1d8);
        _kjCondition_8._39_1_ = 0;
      }
    }
    local_260 = piVar2;
    local_258 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_260);
    piStack_268 = piStack_1d8;
    kj::_::DebugExpression<int_const*>::operator==
              ((DebugComparison<const_int_*,_int_*> *)local_250,
               (DebugExpression<int_const*> *)&local_258,&stack0xfffffffffffffd98);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
    if (!bVar1) {
      local_269 = kj::_::Debug::shouldLog(ERROR);
      while (local_269 != false) {
        ref2 = piStack_1d8;
        local_278 = piVar2;
        kj::_::Debug::
        log<char_const(&)[32],kj::_::DebugComparison<int_const*,int*>&,int_const*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x5c,ERROR,"\"failed: expected \" \"(&ref) == (&v)\", _kjCondition, &ref, &v",
                   (char (*) [32])"failed: expected (&ref) == (&v)",
                   (DebugComparison<const_int_*,_int_*> *)local_250,&local_278,&ref2);
        local_269 = false;
      }
    }
    _kjCondition_9.result = true;
    _kjCondition_9._33_3_ = 0;
    _kjCondition_9._36_4_ =
         Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__3,int>
                   ((Maybe<int> *)&stack0xffffffffffffffe8,
                    (anon_class_4_1_023c9c10 *)&_kjCondition_9.result);
    value = &_kjCondition_9.field_0x24;
    local_2c8 = piVar2;
    local_2c0 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2c8);
    piStack_2d0 = (int *)value;
    kj::_::DebugExpression<int_const*>::operator!=
              ((DebugComparison<const_int_*,_const_int_*> *)local_2b8,
               (DebugExpression<int_const*> *)&local_2c0,&stack0xfffffffffffffd30);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
    if (!bVar1) {
      local_2d1 = kj::_::Debug::shouldLog(ERROR);
      while (local_2d1 != false) {
        _kjCondition_10._32_8_ = value;
        local_2e0 = piVar2;
        kj::_::Debug::
        log<char_const(&)[35],kj::_::DebugComparison<int_const*,int_const*>&,int_const*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x5f,ERROR,
                   "\"failed: expected \" \"(&ref) != (&ref2)\", _kjCondition, &ref, &ref2",
                   (char (*) [35])"failed: expected (&ref) != (&ref2)",
                   (DebugComparison<const_int_*,_const_int_*> *)local_2b8,&local_2e0,
                   (int **)&_kjCondition_10.result);
        local_2d1 = false;
      }
    }
    DStack_318 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)value);
    local_31c = 0x7b;
    kj::_::DebugExpression<int_const&>::operator==
              ((DebugComparison<const_int_&,_int> *)local_310,
               (DebugExpression<int_const&> *)&stack0xfffffffffffffce8,&local_31c);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_310);
    if (!bVar1) {
      local_31d = kj::_::Debug::shouldLog(ERROR);
      while (local_31d != false) {
        local_324 = 0x7b;
        kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<int_const&,int>&,int_const&,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x60,ERROR,"\"failed: expected \" \"(ref2) == (123)\", _kjCondition, ref2, 123",
                   (char (*) [33])"failed: expected (ref2) == (123)",
                   (DebugComparison<const_int_&,_int> *)local_310,(int *)value,&local_324);
        local_31d = false;
      }
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&stack0xffffffffffffffe8);
  _kjCondition_12._36_4_ = 0x7b;
  heap<kj::(anonymous_namespace)::CopyOrMove,int>
            ((kj *)&_kj_shouldLog_11,(int *)&_kjCondition_12.field_0x24);
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)local_350,
             (Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)&_kj_shouldLog_11);
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)&_kj_shouldLog_11);
  bVar1 = Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::operator==
                    ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                     local_350);
  _kjCondition_12._34_1_ = ~bVar1 & 1;
  _kjCondition_12._35_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_12.field_0x22);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_12.field_0x23);
  if (!bVar1) {
    _kjCondition_12.result = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_12.result != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x68,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_12.field_0x23);
      _kjCondition_12.result = false;
    }
  }
  DStack_398 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
  kj::_::
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>::
  operator!=((DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_390,
             (DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>
              *)&stack0xfffffffffffffc68,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_390);
  if (!bVar1) {
    _v106._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v106._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x69,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_390);
      _v106._7_1_ = false;
    }
  }
  pOVar5 = kj::_::readMaybe<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>
                     ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                      local_350);
  if (pOVar5 == (Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v111.value.ptr,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x6d);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v111.value.ptr);
  }
  else {
    local_3e0 = 0x7b;
    _kjCondition_13._32_8_ = pOVar5;
    DStack_3dc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3e0);
    pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->
                       ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)
                        _kjCondition_13._32_8_);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_3d8,&stack0xfffffffffffffc24,&pCVar6->i);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d8);
    if (!bVar1) {
      local_3e1 = kj::_::Debug::shouldLog(ERROR);
      while (local_3e1 != false) {
        local_3e8 = 0x7b;
        pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->
                           ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)
                            _kjCondition_13._32_8_);
        kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x6b,ERROR,"\"failed: expected \" \"(123) == (v->i)\", _kjCondition, 123, v->i",
                   (char (*) [33])"failed: expected (123) == (v->i)",
                   (DebugComparison<int,_int_&> *)local_3d8,&local_3e8,&pCVar6->i);
        local_3e1 = false;
      }
    }
  }
  pMVar7 = mv<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>>
                     ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                      local_350);
  kj::_::readMaybe<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>((_ *)&v_4,pMVar7);
  pOVar5 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)&v_4);
  if (pOVar5 == (Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_15.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x72);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_15.result);
  }
  else {
    _kjCondition_14._32_8_ =
         kj::_::OwnOwn<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator*
                   ((OwnOwn<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)&v_4);
    local_448 = 0x7b;
    DStack_444 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_448);
    pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->
                       ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)
                        _kjCondition_14._32_8_);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_440,&stack0xfffffffffffffbbc,&pCVar6->i);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_440);
    if (!bVar1) {
      local_449 = kj::_::Debug::shouldLog(ERROR);
      while (local_449 != false) {
        local_450 = 0x7b;
        pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->
                           ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)
                            _kjCondition_14._32_8_);
        kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x70,ERROR,"\"failed: expected \" \"(123) == (v->i)\", _kjCondition, 123, v->i",
                   (char (*) [33])"failed: expected (123) == (v->i)",
                   (DebugComparison<int,_int_&> *)local_440,&local_450,&pCVar6->i);
        local_449 = false;
      }
    }
  }
  kj::_::OwnOwn<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)&v_4);
  local_498 = 0x1c8;
  local_494 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_498);
  local_4ac = 0x1c8;
  heap<kj::(anonymous_namespace)::CopyOrMove,int>((kj *)local_4a8,&local_4ac);
  pOVar5 = Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::orDefault
                     ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                      local_350,
                      (Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)local_4a8);
  pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(pOVar5);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_490,&local_494,&pCVar6->i);
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t> *)local_4a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
  if (!bVar1) {
    local_4ad = kj::_::Debug::shouldLog(ERROR);
    while (local_4ad != false) {
      local_4b4 = 0x1c8;
      _kjCondition_16._36_4_ = 0x1c8;
      heap<kj::(anonymous_namespace)::CopyOrMove,int>
                ((kj *)&local_4c8,(int *)&_kjCondition_16.field_0x24);
      pOVar5 = Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::orDefault
                         ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350,&local_4c8);
      pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(pOVar5);
      kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x75,ERROR,
                 "\"failed: expected \" \"(456) == (m.orDefault(heap<CopyOrMove>(456))->i)\", _kjCondition, 456, m.orDefault(heap<CopyOrMove>(456))->i"
                 ,(char (*) [66])"failed: expected (456) == (m.orDefault(heap<CopyOrMove>(456))->i)"
                 ,(DebugComparison<int,_const_int_&> *)local_490,&local_4b4,&pCVar6->i);
      Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_4c8);
      local_4ad = false;
    }
  }
  DStack_500 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
  kj::_::
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>::
  operator==((DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_4f8,
             (DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>
              *)&stack0xfffffffffffffb00,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f8);
  if (!bVar1) {
    _kjCondition_17._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_17._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x76,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_4f8);
      _kjCondition_17._39_1_ = 0;
    }
  }
  _kjCondition_17._38_1_ = 0;
  local_538 = 0x7b;
  local_534 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_538);
  pMVar7 = mv<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>>
                     ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                      local_350);
  puStack_550 = &_kjCondition_17.field_0x26;
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>::
  orDefault<kj::(anonymous_namespace)::TestCase64::run()::__4,kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>
            ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>> *)&local_548,
             (anon_class_8_1_bd98cb13 *)pMVar7);
  pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(&local_548);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_530,&local_534,&pCVar6->i);
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_548);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_530);
  if (!bVar1) {
    local_551 = kj::_::Debug::shouldLog(ERROR);
    while (local_551 != false) {
      local_558 = 0x7b;
      pMVar7 = mv<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>>
                         ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
      _kjCondition_18.value = (bool *)&_kjCondition_17.field_0x26;
      Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>::
      orDefault<kj::(anonymous_namespace)::TestCase64::run()::__5,kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>
                ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>> *)
                 &local_568,(anon_class_8_1_bd98cb13 *)pMVar7);
      pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(&local_568);
      kj::_::Debug::log<char_const(&)[102],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"(123) == (mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(123); })->i)\", _kjCondition, 123, mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(123); })->i"
                 ,(char (*) [102])
                  "failed: expected (123) == (mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(123); })->i)"
                 ,(DebugComparison<int,_int_&> *)local_530,&local_558,&pCVar6->i);
      Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_568);
      local_551 = false;
    }
  }
  DStack_578 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)&_kjCondition_17.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffa88)
  ;
  if (!bVar1) {
    _kjCondition_19._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_19._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x7d,ERROR,"\"failed: expected \" \"ranLazy\", _kjCondition",
                 (char (*) [25])"failed: expected ranLazy",&stack0xfffffffffffffa88);
      _kjCondition_19._39_1_ = 0;
    }
  }
  DStack_5b0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
  kj::_::
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>::
  operator==((DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_5a8,
             (DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>
              *)&stack0xfffffffffffffa50,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5a8);
  if (!bVar1) {
    local_5b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b1 != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x7e,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_5a8);
      local_5b1 = false;
    }
  }
  _kjCondition_20._36_4_ = 0x7b;
  heap<kj::(anonymous_namespace)::CopyOrMove,int>
            ((kj *)&local_5d8,(int *)&_kjCondition_20.field_0x24);
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::Maybe
            (&local_5c8,&local_5d8);
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)local_350,
             &local_5c8);
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::~Maybe(&local_5c8);
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_5d8);
  DStack_610 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
  kj::_::
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>::
  operator!=((DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_608,
             (DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>
              *)&stack0xfffffffffffff9f0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_608);
  if (!bVar1) {
    _kjCondition_21._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_21._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x81,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_608);
      _kjCondition_21._39_1_ = 0;
    }
  }
  _kjCondition_17._38_1_ = 0;
  local_648 = 0x7b;
  local_644 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_648);
  pMVar7 = mv<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>>
                     ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                      local_350);
  puStack_660 = &_kjCondition_17.field_0x26;
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>::
  orDefault<kj::(anonymous_namespace)::TestCase64::run()::__6,kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>
            ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>> *)&local_658,
             (anon_class_8_1_bd98cb13 *)pMVar7);
  pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(&local_658);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_640,&local_644,&pCVar6->i);
  Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_658);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_640);
  if (!bVar1) {
    local_661 = kj::_::Debug::shouldLog(ERROR);
    while (local_661 != false) {
      local_668 = 0x7b;
      pMVar7 = mv<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>>
                         ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                          local_350);
      Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>::
      orDefault<kj::(anonymous_namespace)::TestCase64::run()::__7,kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>
                ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>> *)
                 &local_678,(anon_class_8_1_bd98cb13 *)pMVar7);
      pCVar6 = Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::operator->(&local_678);
      kj::_::Debug::log<char_const(&)[102],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x86,ERROR,
                 "\"failed: expected \" \"(123) == (mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(456); })->i)\", _kjCondition, 123, mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(456); })->i"
                 ,(char (*) [102])
                  "failed: expected (123) == (mv(m).orDefault([&] { ranLazy = true; return heap<CopyOrMove>(456); })->i)"
                 ,(DebugComparison<int,_int_&> *)local_640,&local_668,&pCVar6->i);
      Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>::~Own(&local_678);
      local_661 = false;
    }
  }
  _kjCondition_23._38_1_ = ~_kjCondition_17._38_1_ & 1;
  _kjCondition_23._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_23.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_23.field_0x27);
  if (!bVar1) {
    _kjCondition_23._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_23._37_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x87,ERROR,"\"failed: expected \" \"!(ranLazy)\", _kjCondition",
                 (char (*) [28])"failed: expected !(ranLazy)",
                 (DebugExpression<bool> *)&_kjCondition_23.field_0x27);
      _kjCondition_23._37_1_ = 0;
    }
  }
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)
                  local_350);
  kj::_::
  DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>::
  operator==((DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_6b0,
             (DebugExpression<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&>
              *)&empty.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6b0);
  if (!bVar1) {
    empty.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (empty.ptr._3_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,decltype(nullptr)>>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x88,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>_&,_const_kj::None_&>
                  *)local_6b0);
      empty.ptr._3_1_ = 0;
    }
  }
  Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<kj::(anonymous_namespace)::CopyOrMove,_std::nullptr_t>_> *)local_350);
  Maybe<int>::Maybe((Maybe<int> *)((long)&ref1 + 4));
  ref1._0_4_ = 5;
  _kjCondition_24._32_8_ = &ref1;
  piVar2 = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__8,int&>
                     ((Maybe<int> *)((long)&ref1 + 4),
                      (anon_class_8_1_f942e9ae *)&_kjCondition_24.result);
  local_710 = piVar2;
  local_708 = (int *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_710);
  ppiStack_718 = &ref1;
  kj::_::DebugExpression<int*>::operator==
            ((DebugComparison<int_*,_int_*> *)local_700,(DebugExpression<int*> *)&local_708,
             (int **)&stack0xfffffffffffff8e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_700);
  if (!bVar1) {
    local_719 = kj::_::Debug::shouldLog(ERROR);
    while (local_719 != false) {
      ppiStack_730 = &ref1;
      local_728 = piVar2;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int*,int*>&,int*,int*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(&ref1) == (&defaultValue)\", _kjCondition, &ref1, &defaultValue"
                 ,(char (*) [44])"failed: expected (&ref1) == (&defaultValue)",
                 (DebugComparison<int_*,_int_*> *)local_700,&local_728,
                 (int **)&stack0xfffffffffffff8d0);
      local_719 = false;
    }
  }
  _kjCondition_25._32_8_ = &ref1;
  local_734 = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__9,int>
                        ((Maybe<int> *)((long)&ref1 + 4),
                         (anon_class_8_1_f942e9ae *)&_kjCondition_25.result);
  local_778 = &local_734;
  local_770 = (int *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_778);
  ppiStack_780 = &ref1;
  kj::_::DebugExpression<int*>::operator!=
            ((DebugComparison<int_*,_int_*> *)local_768,(DebugExpression<int*> *)&local_770,
             (int **)&stack0xfffffffffffff880);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_768);
  if (!bVar1) {
    local_781 = kj::_::Debug::shouldLog(ERROR);
    while (local_781 != false) {
      local_790 = &local_734;
      m_2.ptr = (NullableValue<int>)&ref1;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int*,int*>&,int*,int*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"(&ref2) != (&defaultValue)\", _kjCondition, &ref2, &defaultValue"
                 ,(char (*) [44])"failed: expected (&ref2) != (&defaultValue)",
                 (DebugComparison<int_*,_int_*> *)local_768,&local_790,(int **)&m_2);
      local_781 = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)((long)&ref1 + 4));
  _kjCondition_27._36_4_ = 0;
  Maybe<int>::Maybe((Maybe<int> *)&_kj_shouldLog_26,(int *)&_kjCondition_27.field_0x24);
  bVar1 = Maybe<int>::operator==((Maybe<int> *)&_kj_shouldLog_26);
  _kjCondition_27._34_1_ = ~bVar1 & 1;
  _kjCondition_27._35_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_27.field_0x22);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_27.field_0x23);
  if (!bVar1) {
    _kjCondition_27.result = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_27.result != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x99,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_27.field_0x23);
      _kjCondition_27.result = false;
    }
  }
  DStack_7d8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<int> *)&_kj_shouldLog_26);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_7d0,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xfffffffffffff828,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7d0);
  if (!bVar1) {
    _v155._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v155._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x9a,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_7d0);
      _v155._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int> *)&_kj_shouldLog_26);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v160,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x9e);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v160);
  }
  else {
    local_820 = 0;
    _kjCondition_28._32_8_ = piVar2;
    DStack_81c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_820);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_818,&stack0xfffffffffffff7e4,
               (int *)_kjCondition_28._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_818);
    if (!bVar1) {
      local_821 = kj::_::Debug::shouldLog(ERROR);
      while (local_821 != false) {
        local_828 = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x9c,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_818,&local_828,(int *)_kjCondition_28._32_8_
                  );
        local_821 = false;
      }
    }
  }
  pMVar3 = mv<kj::Maybe<int>>((Maybe<int> *)&_kj_shouldLog_26);
  pNVar4 = kj::_::readMaybe<int>(pMVar3);
  kj::_::NullableValue<int>::NullableValue((NullableValue<int> *)&v_6,pNVar4);
  piVar2 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&v_6);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_30.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xa3);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_30.result);
  }
  else {
    _kjCondition_29._32_8_ = kj::_::NullableValue<int>::operator*((NullableValue<int> *)&v_6);
    local_880 = 0;
    DStack_87c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_880);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_878,&stack0xfffffffffffff784,
               (int *)_kjCondition_29._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_878);
    if (!bVar1) {
      local_881 = kj::_::Debug::shouldLog(ERROR);
      while (local_881 != false) {
        local_888 = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xa1,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_878,&local_888,(int *)_kjCondition_29._32_8_
                  );
        local_881 = false;
      }
    }
  }
  kj::_::NullableValue<int>::~NullableValue((NullableValue<int> *)&v_6);
  iStack_8d0 = 0;
  local_8cc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff730);
  local_8d4 = 0x1c8;
  piVar2 = Maybe<int>::orDefault((Maybe<int> *)&_kj_shouldLog_26,&local_8d4);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_8c8,&local_8cc,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8c8);
  if (!bVar1) {
    local_8d5 = kj::_::Debug::shouldLog(ERROR);
    while (local_8d5 != false) {
      iStack_8dc = 0;
      local_8e0 = 0x1c8;
      piVar2 = Maybe<int>::orDefault((Maybe<int> *)&_kj_shouldLog_26,&local_8e0);
      kj::_::Debug::log<char_const(&)[43],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xa5,ERROR,
                 "\"failed: expected \" \"(0) == (m.orDefault(456))\", _kjCondition, 0, m.orDefault(456)"
                 ,(char (*) [43])"failed: expected (0) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_8c8,&stack0xfffffffffffff724,piVar2);
      local_8d5 = false;
    }
  }
  _kjCondition_31._31_1_ = 0;
  local_914[1] = 0;
  local_90c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_914 + 1);
  aStack_920.ranLazy = (bool *)&_kjCondition_31.field_0x1f;
  local_914[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__10,int>
                           ((Maybe<int> *)&_kj_shouldLog_26,&stack0xfffffffffffff6e0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_908,&local_90c,local_914);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_908);
  if (!bVar1) {
    local_921 = kj::_::Debug::shouldLog(ERROR);
    while (local_921 != false) {
      local_92c[1] = 0;
      unique0x00004880 = &_kjCondition_31.field_0x1f;
      local_92c[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__11,int>
                               ((Maybe<int> *)&_kj_shouldLog_26,
                                (anon_class_8_1_bd98cb13 *)&m_3.ptr.field_1);
      kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xaa,ERROR,
                 "\"failed: expected \" \"(0) == (m.orDefault([&] { ranLazy = true; return 456; }))\", _kjCondition, 0, m.orDefault([&] { ranLazy = true; return 456; })"
                 ,(char (*) [75])
                  "failed: expected (0) == (m.orDefault([&] { ranLazy = true; return 456; }))",
                 (DebugComparison<int,_int> *)local_908,local_92c + 1,local_92c);
      local_921 = false;
    }
  }
  m_3.ptr._2_1_ = ~_kjCondition_31._31_1_ & 1;
  m_3.ptr._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&m_3.ptr.field_0x2);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&m_3.ptr.field_0x3);
  if (!bVar1) {
    m_3.ptr._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while (m_3.ptr._1_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xab,ERROR,"\"failed: expected \" \"!(ranLazy)\", _kjCondition",
                 (char (*) [28])"failed: expected !(ranLazy)",
                 (DebugExpression<bool> *)&m_3.ptr.field_0x3);
      m_3.ptr._1_1_ = 0;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kj_shouldLog_26);
  Maybe<int>::Maybe();
  DStack_978 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<int> *)&_kjCondition_33.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator==
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_970,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xfffffffffffff688,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_970);
  if (!bVar1) {
    _v178._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v178._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xb0,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_970);
      _v178._7_1_ = false;
    }
  }
  _v178._5_1_ = Maybe<int>::operator==((Maybe<int> *)&_kjCondition_33.field_0x24);
  _v178._6_1_ = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&_v178 + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&_v178 + 6));
  if (!bVar1) {
    _v178._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v178._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xb1,ERROR,"\"failed: expected \" \"!(m != kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m != kj::none)",
                 (DebugExpression<bool> *)((long)&_v178 + 6));
      _v178._3_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int> *)&_kjCondition_33.field_0x24);
  if (piVar2 != (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_35.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xb3);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_35.result);
    local_9d8 = 0;
    DStack_9d4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_9d8);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_9d0,&stack0xfffffffffffff62c,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9d0);
    if (!bVar1) {
      _v182.field_1.value._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_v182.field_1.value._3_1_ != '\0') {
        _v182.isSet = false;
        _v182._1_3_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xb4,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_9d0,(int *)&_v182,piVar2);
        _v182.field_1.value._3_1_ = 0;
      }
    }
  }
  pMVar3 = mv<kj::Maybe<int>>((Maybe<int> *)&_kjCondition_33.field_0x24);
  pNVar4 = kj::_::readMaybe<int>(pMVar3);
  kj::_::NullableValue<int>::NullableValue((NullableValue<int> *)&v_8,pNVar4);
  piVar2 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&v_8);
  if (piVar2 != (int *)0x0) {
    piVar2 = kj::_::NullableValue<int>::operator*((NullableValue<int> *)&v_8);
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_36.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xb7);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_36.result);
    local_a38 = 0;
    DStack_a34 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a38);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_a30,&stack0xfffffffffffff5cc,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a30);
    if (!bVar1) {
      _kjCondition_37._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_37._39_1_ != '\0') {
        _kjCondition_37.result = false;
        _kjCondition_37._33_3_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xb8,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_a30,(int *)&_kjCondition_37.result,piVar2);
        _kjCondition_37._39_1_ = 0;
      }
    }
  }
  kj::_::NullableValue<int>::~NullableValue((NullableValue<int> *)&v_8);
  iStack_a70 = 0x1c8;
  local_a6c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff590);
  local_a74 = 0x1c8;
  piVar2 = Maybe<int>::orDefault((Maybe<int> *)&_kjCondition_33.field_0x24,&local_a74);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_a68,&local_a6c,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a68);
  if (!bVar1) {
    local_a75 = kj::_::Debug::shouldLog(ERROR);
    while (local_a75 != false) {
      iStack_a7c = 0x1c8;
      local_a80 = 0x1c8;
      piVar2 = Maybe<int>::orDefault((Maybe<int> *)&_kjCondition_33.field_0x24,&local_a80);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xba,ERROR,
                 "\"failed: expected \" \"(456) == (m.orDefault(456))\", _kjCondition, 456, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (456) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_a68,&stack0xfffffffffffff584,piVar2);
      local_a75 = false;
    }
  }
  _kjCondition_38._31_1_ = 0;
  local_ab4[1] = 0x1c8;
  local_aac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_ab4 + 1);
  aStack_ac0.ranLazy = (bool *)&_kjCondition_38.field_0x1f;
  local_ab4[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__12,int>
                           ((Maybe<int> *)&_kjCondition_33.field_0x24,&stack0xfffffffffffff540);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_aa8,&local_aac,local_ab4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_aa8);
  if (!bVar1) {
    local_ac1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ac1 != false) {
      local_acc[1] = 0x1c8;
      _kjCondition_39.value = (bool *)&_kjCondition_38.field_0x1f;
      local_acc[0] = Maybe<int>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__13,int>
                               ((Maybe<int> *)&_kjCondition_33.field_0x24,
                                (anon_class_8_1_bd98cb13 *)&_kjCondition_39);
      kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xbf,ERROR,
                 "\"failed: expected \" \"(456) == (m.orDefault([&] { ranLazy = true; return 456; }))\", _kjCondition, 456, m.orDefault([&] { ranLazy = true; return 456; })"
                 ,(char (*) [77])
                  "failed: expected (456) == (m.orDefault([&] { ranLazy = true; return 456; }))",
                 (DebugComparison<int,_int> *)local_aa8,local_acc + 1,local_acc);
      local_ac1 = false;
    }
  }
  _i = kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_38.field_0x1f);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&i);
  if (!bVar1) {
    m_4.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)m_4.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xc0,ERROR,"\"failed: expected \" \"ranLazy\", _kjCondition",
                 (char (*) [25])"failed: expected ranLazy",(DebugExpression<bool_&> *)&i);
      m_4.ptr._7_1_ = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_33.field_0x24);
  m_4.ptr._0_4_ = 0xea;
  Maybe<int_&>::Maybe((Maybe<int_&> *)&stack0xfffffffffffff510,(int *)&m_4);
  bVar1 = Maybe<int_&>::operator==((Maybe<int_&> *)&stack0xfffffffffffff510);
  _kjCondition_41._38_1_ = (bVar1 ^ 0xffU) & 1;
  _kjCondition_41._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_41.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_41.field_0x27);
  if (!bVar1) {
    _kjCondition_41._36_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_41._36_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xc6,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_41.field_0x27);
      _kjCondition_41._36_1_ = 0;
    }
  }
  DStack_b28 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<int_&> *)&stack0xfffffffffffff510);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_b20,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xfffffffffffff4d8,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b20);
  if (!bVar1) {
    _v200._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v200._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,199,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_b20);
      _v200._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int_&> *)&stack0xfffffffffffff510);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v205,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xcb);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v205);
  }
  else {
    local_b78 = &m_4;
    _kjCondition_42._32_8_ = piVar2;
    local_b70 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_b78);
    piStack_b80 = (int *)_kjCondition_42._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_b68,(DebugExpression<int*> *)&local_b70,
               &stack0xfffffffffffff480);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b68);
    if (!bVar1) {
      local_b81 = kj::_::Debug::shouldLog(ERROR);
      while (local_b81 != false) {
        local_b90 = &m_4;
        local_b98 = (int *)_kjCondition_42._32_8_;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xc9,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_int_*> *)local_b68,(int **)&local_b90,&local_b98);
        local_b81 = false;
      }
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>((Maybe<int_&> *)&stack0xfffffffffffff510);
  piVar2 = kj::_::readMaybe<int>(pMVar8);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_44.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xd0);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_44.result);
  }
  else {
    local_bf8 = &m_4;
    _kjCondition_43._32_8_ = piVar2;
    local_bf0 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_bf8);
    piStack_c00 = (int *)_kjCondition_43._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_be8,(DebugExpression<int*> *)&local_bf0,
               &stack0xfffffffffffff400);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_be8);
    if (!bVar1) {
      local_c01 = kj::_::Debug::shouldLog(ERROR);
      while (local_c01 != false) {
        local_c10 = &m_4;
        local_c18 = (int *)_kjCondition_43._32_8_;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xce,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_int_*> *)local_be8,(int **)&local_c10,&local_c18);
        local_c01 = false;
      }
    }
  }
  iStack_c60 = 0xea;
  local_c5c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff3a0);
  local_c64 = 0x1c8;
  piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xfffffffffffff510,&local_c64);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_c58,&local_c5c,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c58);
  if (!bVar1) {
    local_c65 = kj::_::Debug::shouldLog(ERROR);
    while (local_c65 != false) {
      m_5.ptr._4_4_ = 0xea;
      m_5.ptr._0_4_ = 0x1c8;
      piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xfffffffffffff510,(int *)&m_5);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xd2,ERROR,
                 "\"failed: expected \" \"(234) == (m.orDefault(456))\", _kjCondition, 234, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (234) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_c58,(int *)((long)&m_5.ptr + 4),piVar2);
      local_c65 = false;
    }
  }
  Maybe<int_&>::Maybe(&local_c78);
  DStack_cb0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c78);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator==
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_ca8,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xfffffffffffff350,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ca8);
  if (!bVar1) {
    _v217._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v217._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xd7,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_ca8);
      _v217._7_1_ = false;
    }
  }
  _v217._5_1_ = Maybe<int_&>::operator==(&local_c78);
  _v217._6_1_ = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&_v217 + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&_v217 + 6));
  if (!bVar1) {
    _v217._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v217._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xd8,ERROR,"\"failed: expected \" \"!(m != kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m != kj::none)",
                 (DebugExpression<bool> *)((long)&_v217 + 6));
      _v217._3_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>(&local_c78);
  if (piVar2 != (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_47.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xda);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_47.result);
    local_d10 = 0;
    DStack_d0c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d10);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_d08,&stack0xfffffffffffff2f4,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d08);
    if (!bVar1) {
      _v221._7_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)_v221._7_1_ != false) {
        _v221._0_4_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xdb,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_d08,(int *)&_v221,piVar2);
        _v221._7_1_ = false;
      }
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>(&local_c78);
  piVar2 = kj::_::readMaybe<int>(pMVar8);
  if (piVar2 != (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_48.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xde);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_48.result);
    local_d70 = 0;
    DStack_d6c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d70);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_d68,&stack0xfffffffffffff294,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d68);
    if (!bVar1) {
      _kjCondition_49._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_49._39_1_ != '\0') {
        _kjCondition_49.result = false;
        _kjCondition_49._33_3_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xdf,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_d68,(int *)&_kjCondition_49.result,piVar2);
        _kjCondition_49._39_1_ = 0;
      }
    }
  }
  iStack_da8 = 0x1c8;
  local_da4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff258);
  local_dac = 0x1c8;
  piVar2 = Maybe<int_&>::orDefault(&local_c78,&local_dac);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_da0,&local_da4,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_da0);
  if (!bVar1) {
    local_dad = kj::_::Debug::shouldLog(ERROR);
    while (local_dad != false) {
      m_6.ptr._4_4_ = 0x1c8;
      m_6.ptr._0_4_ = 0x1c8;
      piVar2 = Maybe<int_&>::orDefault(&local_c78,(int *)&m_6);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(456) == (m.orDefault(456))\", _kjCondition, 456, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (456) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_da0,(int *)((long)&m_6.ptr + 4),piVar2);
      local_dad = false;
    }
  }
  Maybe<int_&>::Maybe((Maybe<int_&> *)&stack0xfffffffffffff240,(int *)&m_4);
  bVar1 = Maybe<int_&>::operator==((Maybe<int_&> *)&stack0xfffffffffffff240);
  _kjCondition_51._38_1_ = (bVar1 ^ 0xffU) & 1;
  _kjCondition_51._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_51.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_51.field_0x27);
  if (!bVar1) {
    _kjCondition_51._36_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_51._36_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xe6,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_51.field_0x27);
      _kjCondition_51._36_1_ = 0;
    }
  }
  DStack_df8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<int_&> *)&stack0xfffffffffffff240);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_df0,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xfffffffffffff208,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_df0);
  if (!bVar1) {
    _v232._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v232._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xe7,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_df0);
      _v232._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int_&> *)&stack0xfffffffffffff240);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v237,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xeb);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v237);
  }
  else {
    local_e48 = &m_4;
    _kjCondition_52._32_8_ = piVar2;
    local_e40 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_e48);
    piStack_e50 = (int *)_kjCondition_52._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_e38,(DebugExpression<int*> *)&local_e40,
               &stack0xfffffffffffff1b0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e38);
    if (!bVar1) {
      local_e51 = kj::_::Debug::shouldLog(ERROR);
      while (local_e51 != false) {
        local_e60 = &m_4;
        local_e68 = (int *)_kjCondition_52._32_8_;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xe9,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_int_*> *)local_e38,(int **)&local_e60,&local_e68);
        local_e51 = false;
      }
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>((Maybe<int_&> *)&stack0xfffffffffffff240);
  piVar2 = kj::_::readMaybe<int>(pMVar8);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_54.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xf0);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_54.result);
  }
  else {
    local_ec8 = &m_4;
    _kjCondition_53._32_8_ = piVar2;
    local_ec0 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_ec8);
    piStack_ed0 = (int *)_kjCondition_53._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_eb8,(DebugExpression<int*> *)&local_ec0,
               &stack0xfffffffffffff130);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_eb8);
    if (!bVar1) {
      local_ed1 = kj::_::Debug::shouldLog(ERROR);
      while (local_ed1 != false) {
        local_ee0 = &m_4;
        local_ee8 = (int *)_kjCondition_53._32_8_;
        kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xee,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_int_*> *)local_eb8,(int **)&local_ee0,&local_ee8);
        local_ed1 = false;
      }
    }
  }
  iStack_f30 = 0xea;
  local_f2c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff0d0);
  local_f34 = 0x1c8;
  piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xfffffffffffff240,&local_f34);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_f28,&local_f2c,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f28);
  if (!bVar1) {
    local_f35 = kj::_::Debug::shouldLog(ERROR);
    while (local_f35 != false) {
      m2.ptr._4_4_ = 0xea;
      m2.ptr._0_4_ = 0x1c8;
      piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xfffffffffffff240,(int *)&m2);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"(234) == (m.orDefault(456))\", _kjCondition, 234, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (234) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_f28,(int *)((long)&m2.ptr + 4),piVar2);
      local_f35 = false;
    }
  }
  Maybe<int_&>::Maybe((Maybe<int_&> *)&m_7,(int *)&m_4);
  Maybe<const_int_&>::Maybe<int>
            ((Maybe<const_int_&> *)&stack0xfffffffffffff0b0,(Maybe<int_&> *)&m_7);
  bVar1 = Maybe<const_int_&>::operator==((Maybe<const_int_&> *)&stack0xfffffffffffff0b0);
  _kjCondition_56._38_1_ = (bVar1 ^ 0xffU) & 1;
  _kjCondition_56._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_56.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_56.field_0x27);
  if (!bVar1) {
    _kjCondition_56._36_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_56._36_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xf8,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_56.field_0x27);
      _kjCondition_56._36_1_ = 0;
    }
  }
  DStack_f88 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (Maybe<const_int_&> *)&stack0xfffffffffffff0b0);
  kj::_::DebugExpression<kj::Maybe<int_const&>&>::operator!=
            ((DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_f80,
             (DebugExpression<kj::Maybe<int_const&>&> *)&stack0xfffffffffffff078,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f80);
  if (!bVar1) {
    _v250._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v250._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int_const&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0xf9,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_f80);
      _v250._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int_const>((Maybe<const_int_&> *)&stack0xfffffffffffff0b0);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v255,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0xfd);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v255);
  }
  else {
    local_fd8 = &m_4;
    _kjCondition_57._32_8_ = piVar2;
    local_fd0 = (int *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_fd8);
    piStack_fe0 = (int *)_kjCondition_57._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_const_int_*> *)local_fc8,(DebugExpression<int*> *)&local_fd0,
               &stack0xfffffffffffff020);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_fc8);
    if (!bVar1) {
      local_fe1 = kj::_::Debug::shouldLog(ERROR);
      while (local_fe1 != false) {
        local_ff0 = &m_4;
        local_ff8 = (int *)_kjCondition_57._32_8_;
        kj::_::Debug::
        log<char_const(&)[30],kj::_::DebugComparison<int*,int_const*>&,int*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0xfb,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_const_int_*> *)local_fc8,(int **)&local_ff0,&local_ff8);
        local_fe1 = false;
      }
    }
  }
  pMVar9 = mv<kj::Maybe<int_const&>>((Maybe<const_int_&> *)&stack0xfffffffffffff0b0);
  piVar2 = kj::_::readMaybe<int_const>(pMVar9);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_59.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x102);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_59.result);
  }
  else {
    local_1058 = &m_4;
    _kjCondition_58._32_8_ = piVar2;
    local_1050 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int **)&local_1058)
    ;
    piStack_1060 = (int *)_kjCondition_58._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_const_int_*> *)local_1048,
               (DebugExpression<int*> *)&local_1050,&stack0xffffffffffffefa0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1048);
    if (!bVar1) {
      local_1061 = kj::_::Debug::shouldLog(ERROR);
      while (local_1061 != false) {
        local_1070 = &m_4;
        local_1078 = (int *)_kjCondition_58._32_8_;
        kj::_::Debug::
        log<char_const(&)[30],kj::_::DebugComparison<int*,int_const*>&,int*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x100,ERROR,"\"failed: expected \" \"(&i) == (&v)\", _kjCondition, &i, &v",
                   (char (*) [30])"failed: expected (&i) == (&v)",
                   (DebugComparison<int_*,_const_int_*> *)local_1048,(int **)&local_1070,&local_1078
                  );
        local_1061 = false;
      }
    }
  }
  iStack_10c0 = 0xea;
  local_10bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffef40);
  local_10c4 = 0x1c8;
  piVar2 = Maybe<const_int_&>::orDefault((Maybe<const_int_&> *)&stack0xfffffffffffff0b0,&local_10c4)
  ;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_10b8,&local_10bc,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_10b8);
  if (!bVar1) {
    local_10c5 = kj::_::Debug::shouldLog(ERROR);
    while (local_10c5 != false) {
      m_8.ptr._4_4_ = 0xea;
      m_8.ptr._0_4_ = 0x1c8;
      piVar2 = Maybe<const_int_&>::orDefault
                         ((Maybe<const_int_&> *)&stack0xfffffffffffff0b0,(int *)&m_8);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x104,ERROR,
                 "\"failed: expected \" \"(234) == (m.orDefault(456))\", _kjCondition, 234, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (234) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_10b8,(int *)((long)&m_8.ptr + 4),piVar2)
      ;
      local_10c5 = false;
    }
  }
  _kjCondition_60.result = false;
  _kjCondition_60._33_7_ = 0;
  piVar2 = implicitCast<int*,decltype(nullptr)>((void **)&_kjCondition_60.result);
  Maybe<int_&>::Maybe(&local_10d8,piVar2);
  DStack_1110 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_10d8);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator==
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1108,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffeef0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1108);
  if (!bVar1) {
    _v267._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v267._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x109,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1108);
      _v267._7_1_ = false;
    }
  }
  _v267._5_1_ = Maybe<int_&>::operator==(&local_10d8);
  _v267._6_1_ = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&_v267 + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&_v267 + 6));
  if (!bVar1) {
    _v267._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_v267._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x10a,ERROR,"\"failed: expected \" \"!(m != kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m != kj::none)",
                 (DebugExpression<bool> *)((long)&_v267 + 6));
      _v267._3_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>(&local_10d8);
  if (piVar2 != (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_62.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x10c);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_62.result);
    local_1170 = 0;
    DStack_116c = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1170);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_1168,&stack0xffffffffffffee94,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1168);
    if (!bVar1) {
      _v271._7_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)_v271._7_1_ != false) {
        _v271._0_4_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x10d,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_1168,(int *)&_v271,piVar2);
        _v271._7_1_ = false;
      }
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>(&local_10d8);
  piVar2 = kj::_::readMaybe<int>(pMVar8);
  if (piVar2 != (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_63.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x110);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_63.result);
    local_11d0 = 0;
    DStack_11cc = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_11d0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_11c8,&stack0xffffffffffffee34,piVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_11c8);
    if (!bVar1) {
      _kjCondition_64._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_64._39_1_ != '\0') {
        _kjCondition_64.result = false;
        _kjCondition_64._33_3_ = 0;
        kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x111,ERROR,"\"failed: expected \" \"(0) == (v)\", _kjCondition, 0, v",
                   (char (*) [28])"failed: expected (0) == (v)",
                   (DebugComparison<int,_int_&> *)local_11c8,(int *)&_kjCondition_64.result,piVar2);
        _kjCondition_64._39_1_ = 0;
      }
    }
  }
  iStack_1208 = 0x1c8;
  local_1204 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffedf8);
  local_120c = 0x1c8;
  piVar2 = Maybe<int_&>::orDefault(&local_10d8,&local_120c);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_1200,&local_1204,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1200);
  if (!bVar1) {
    local_120d = kj::_::Debug::shouldLog(ERROR);
    while (local_120d != false) {
      mi.ptr.field_1.value = 0x1c8;
      mi.ptr.isSet = true;
      mi.ptr._1_3_ = 1;
      piVar2 = Maybe<int_&>::orDefault(&local_10d8,(int *)&mi);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(456) == (m.orDefault(456))\", _kjCondition, 456, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (456) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_1200,&mi.ptr.field_1.value,piVar2);
      local_120d = false;
    }
  }
  Maybe<int>::Maybe((Maybe<int> *)&m_9,(int *)&m_4);
  Maybe<int&>::Maybe<int,void>((Maybe<int&> *)&stack0xffffffffffffedd8,(Maybe<int> *)&m_9);
  bVar1 = Maybe<int_&>::operator==((Maybe<int_&> *)&stack0xffffffffffffedd8);
  _kjCondition_66._38_1_ = ~bVar1 & 1;
  _kjCondition_66._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_66.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_66.field_0x27);
  if (!bVar1) {
    _kjCondition_66._36_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_66._36_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x119,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_66.field_0x27);
      _kjCondition_66._36_1_ = 0;
    }
  }
  DStack_1260 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int_&> *)&stack0xffffffffffffedd8);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1258,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffeda0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1258);
  if (!bVar1) {
    _v283._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v283._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x11a,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1258);
      _v283._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int_&> *)&stack0xffffffffffffedd8);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x11e);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v288);
  }
  else {
    _kjCondition_67._32_8_ = piVar2;
    local_12b8 = kj::_::readMaybe<int>((Maybe<int> *)&m_9);
    if (local_12b8 == (int *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_12c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x11c,FAILED,"mi != nullptr","");
      kj::_::Debug::Fault::fatal(&local_12c0);
    }
    ppiVar10 = mv<int*>(&local_12b8);
    local_12c8 = *ppiVar10;
    _kj_result = local_12c8;
    local_12a8 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kj_result);
    piStack_12d0 = (int *)_kjCondition_67._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_12a0,(DebugExpression<int*> *)&local_12a8,
               &stack0xffffffffffffed30);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_12a0);
    if (!bVar1) {
      local_12d1 = kj::_::Debug::shouldLog(ERROR);
      while (local_12d1 != false) {
        local_12e8 = kj::_::readMaybe<int>((Maybe<int> *)&m_9);
        if (local_12e8 == (int *)0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_12f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x11c,FAILED,"mi != nullptr","");
          kj::_::Debug::Fault::fatal(&local_12f0);
        }
        ppiVar10 = mv<int*>(&local_12e8);
        local_12f8 = *ppiVar10;
        local_1300 = (int *)_kjCondition_67._32_8_;
        _kj_result_1 = local_12f8;
        kj::_::Debug::log<char_const(&)[338],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x11c,ERROR,
                   "\"failed: expected \" \"(&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\\\", 284, ::kj::Exception::Type::FAILED, \\\"mi\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); }))) == (&v)\", _kjCondition, &(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 284, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })), &v"
                   ,(char (*) [338])
                    "failed: expected (&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 284, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))) == (&v)"
                   ,(DebugComparison<int_*,_int_*> *)local_12a0,&_kj_result_1,&local_1300);
        local_12d1 = false;
      }
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>((Maybe<int_&> *)&stack0xffffffffffffedd8);
  piVar2 = kj::_::readMaybe<int>(pMVar8);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_69.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x123);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_69.result);
  }
  else {
    _kjCondition_68._32_8_ = piVar2;
    local_1368 = kj::_::readMaybe<int>((Maybe<int> *)&m_9);
    if (local_1368 == (int *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_1370,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x121,FAILED,"mi != nullptr","");
      kj::_::Debug::Fault::fatal(&local_1370);
    }
    ppiVar10 = mv<int*>(&local_1368);
    local_1378 = *ppiVar10;
    _kj_result_2 = local_1378;
    local_1358 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kj_result_2);
    piStack_1380 = (int *)_kjCondition_68._32_8_;
    kj::_::DebugExpression<int*>::operator==
              ((DebugComparison<int_*,_int_*> *)local_1350,(DebugExpression<int*> *)&local_1358,
               &stack0xffffffffffffec80);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1350);
    if (!bVar1) {
      local_1381 = kj::_::Debug::shouldLog(ERROR);
      while (local_1381 != false) {
        local_1398 = kj::_::readMaybe<int>((Maybe<int> *)&m_9);
        if (local_1398 == (int *)0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_13a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x121,FAILED,"mi != nullptr","");
          kj::_::Debug::Fault::fatal(&local_13a0);
        }
        ppiVar10 = mv<int*>(&local_1398);
        local_13a8 = *ppiVar10;
        local_13b0 = (int *)_kjCondition_68._32_8_;
        _kj_result_3 = local_13a8;
        kj::_::Debug::log<char_const(&)[338],kj::_::DebugComparison<int*,int*>&,int*,int*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x121,ERROR,
                   "\"failed: expected \" \"(&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\\\", 289, ::kj::Exception::Type::FAILED, \\\"mi\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); }))) == (&v)\", _kjCondition, &(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 289, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })), &v"
                   ,(char (*) [338])
                    "failed: expected (&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 289, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))) == (&v)"
                   ,(DebugComparison<int_*,_int_*> *)local_1350,&_kj_result_3,&local_13b0);
        local_1381 = false;
      }
    }
  }
  iStack_13f8 = 0xea;
  local_13f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffec08);
  local_13fc = 0x1c8;
  piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xffffffffffffedd8,&local_13fc);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_13f0,&local_13f4,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13f0);
  if (!bVar1) {
    local_13fd = kj::_::Debug::shouldLog(ERROR);
    while (local_13fd != false) {
      mi_1.ptr.field_1.value = 0xea;
      mi_1.ptr.isSet = true;
      mi_1.ptr._1_3_ = 1;
      piVar2 = Maybe<int_&>::orDefault((Maybe<int_&> *)&stack0xffffffffffffedd8,(int *)&mi_1);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x125,ERROR,
                 "\"failed: expected \" \"(234) == (m.orDefault(456))\", _kjCondition, 234, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (234) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_13f0,&mi_1.ptr.field_1.value,piVar2);
      local_13fd = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&m_9);
  Maybe<int>::Maybe();
  Maybe<int&>::Maybe<int,void>((Maybe<int&> *)&_kjCondition_70.result,&local_1410);
  DStack_1450 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int_&> *)&_kjCondition_70.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator==
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1448,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffebb0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1448);
  if (!bVar1) {
    _v300._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v300._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,299,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1448);
      _v300._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int>((Maybe<int_&> *)&_kjCondition_70.result);
  if (piVar2 != (int *)0x0) {
    mi_2.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (mi_2.ptr._3_1_ != '\0') {
      kj::_::Debug::log<int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x12d,ERROR,"v",piVar2);
      mi_2.ptr._3_1_ = 0;
    }
  }
  Maybe<int>::~Maybe(&local_1410);
  pMVar3 = (Maybe<int> *)((long)&m_11.ptr + 4);
  Maybe<int>::Maybe(pMVar3,(int *)&m_4);
  Maybe<int_const&>::Maybe<int,void>((Maybe<int_const&> *)&stack0xffffffffffffeb80,pMVar3);
  bVar1 = Maybe<const_int_&>::operator==((Maybe<const_int_&> *)&stack0xffffffffffffeb80);
  _kjCondition_72._38_1_ = ~bVar1 & 1;
  _kjCondition_72._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_72.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_72.field_0x27);
  if (!bVar1) {
    _kjCondition_72._36_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_72._36_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x134,ERROR,"\"failed: expected \" \"!(m == kj::none)\", _kjCondition",
                 (char (*) [34])"failed: expected !(m == kj::none)",
                 (DebugExpression<bool> *)&_kjCondition_72.field_0x27);
      _kjCondition_72._36_1_ = 0;
    }
  }
  DStack_14b8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<const_int_&> *)&stack0xffffffffffffeb80);
  kj::_::DebugExpression<kj::Maybe<int_const&>&>::operator!=
            ((DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_14b0,
             (DebugExpression<kj::Maybe<int_const&>&> *)&stack0xffffffffffffeb48,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14b0);
  if (!bVar1) {
    _v310._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v310._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int_const&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x135,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_14b0);
      _v310._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int_const>((Maybe<const_int_&> *)&stack0xffffffffffffeb80);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v315,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x139);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v315);
  }
  else {
    _kjCondition_73._32_8_ = piVar2;
    local_1510 = kj::_::readMaybe<int>((Maybe<int> *)((long)&m_11.ptr + 4));
    if (local_1510 == (int *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_1518,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x137,FAILED,"mi != nullptr","");
      kj::_::Debug::Fault::fatal(&local_1518);
    }
    ppiVar10 = mv<int_const*>(&local_1510);
    local_1520 = *ppiVar10;
    _kj_result_4 = local_1520;
    local_1500 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kj_result_4);
    piStack_1528 = (int *)_kjCondition_73._32_8_;
    kj::_::DebugExpression<int_const*>::operator==
              ((DebugComparison<const_int_*,_const_int_*> *)local_14f8,
               (DebugExpression<int_const*> *)&local_1500,&stack0xffffffffffffead8);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14f8);
    if (!bVar1) {
      local_1529 = kj::_::Debug::shouldLog(ERROR);
      while (local_1529 != false) {
        local_1540 = kj::_::readMaybe<int>((Maybe<int> *)((long)&m_11.ptr + 4));
        if (local_1540 == (int *)0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_1548,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x137,FAILED,"mi != nullptr","");
          kj::_::Debug::Fault::fatal(&local_1548);
        }
        ppiVar10 = mv<int_const*>(&local_1540);
        local_1550 = *ppiVar10;
        local_1558 = (int *)_kjCondition_73._32_8_;
        _kj_result_5 = local_1550;
        kj::_::Debug::
        log<char_const(&)[338],kj::_::DebugComparison<int_const*,int_const*>&,int_const*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x137,ERROR,
                   "\"failed: expected \" \"(&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\\\", 311, ::kj::Exception::Type::FAILED, \\\"mi\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); }))) == (&v)\", _kjCondition, &(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 311, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })), &v"
                   ,(char (*) [338])
                    "failed: expected (&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 311, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))) == (&v)"
                   ,(DebugComparison<const_int_*,_const_int_*> *)local_14f8,&_kj_result_5,
                   &local_1558);
        local_1529 = false;
      }
    }
  }
  pMVar9 = mv<kj::Maybe<int_const&>>((Maybe<const_int_&> *)&stack0xffffffffffffeb80);
  piVar2 = kj::_::readMaybe<int_const>(pMVar9);
  if (piVar2 == (int *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_kjCondition_75.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x13e);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition_75.result);
  }
  else {
    _kjCondition_74._32_8_ = piVar2;
    local_15c0 = kj::_::readMaybe<int>((Maybe<int> *)((long)&m_11.ptr + 4));
    if (local_15c0 == (int *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_15c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x13c,FAILED,"mi != nullptr","");
      kj::_::Debug::Fault::fatal(&local_15c8);
    }
    ppiVar10 = mv<int_const*>(&local_15c0);
    local_15d0 = *ppiVar10;
    _kj_result_6 = local_15d0;
    local_15b0 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kj_result_6);
    piStack_15d8 = (int *)_kjCondition_74._32_8_;
    kj::_::DebugExpression<int_const*>::operator==
              ((DebugComparison<const_int_*,_const_int_*> *)local_15a8,
               (DebugExpression<int_const*> *)&local_15b0,&stack0xffffffffffffea28);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_15a8);
    if (!bVar1) {
      local_15d9 = kj::_::Debug::shouldLog(ERROR);
      while (local_15d9 != false) {
        local_15f0 = kj::_::readMaybe<int>((Maybe<int> *)((long)&m_11.ptr + 4));
        if (local_15f0 == (int *)0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_15f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                     ,0x13c,FAILED,"mi != nullptr","");
          kj::_::Debug::Fault::fatal(&local_15f8);
        }
        ppiVar10 = mv<int_const*>(&local_15f0);
        local_1600 = *ppiVar10;
        local_1608 = (int *)_kjCondition_74._32_8_;
        _kj_result_7 = local_1600;
        kj::_::Debug::
        log<char_const(&)[338],kj::_::DebugComparison<int_const*,int_const*>&,int_const*,int_const*>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x13c,ERROR,
                   "\"failed: expected \" \"(&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\\\", 316, ::kj::Exception::Type::FAILED, \\\"mi\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); }))) == (&v)\", _kjCondition, &(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 316, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })), &v"
                   ,(char (*) [338])
                    "failed: expected (&(*({ auto _kj_result = ::kj::_::readMaybe(mi); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++\", 316, ::kj::Exception::Type::FAILED, \"mi\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))) == (&v)"
                   ,(DebugComparison<const_int_*,_const_int_*> *)local_15a8,&_kj_result_7,
                   &local_1608);
        local_15d9 = false;
      }
    }
  }
  iStack_1650 = 0xea;
  local_164c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffe9b0);
  local_1654 = 0x1c8;
  piVar2 = Maybe<const_int_&>::orDefault((Maybe<const_int_&> *)&stack0xffffffffffffeb80,&local_1654)
  ;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_const_int_&> *)local_1648,&local_164c,piVar2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1648);
  if (!bVar1) {
    local_1655 = kj::_::Debug::shouldLog(ERROR);
    while (local_1655 != false) {
      mi_3.ptr.field_1.value = 0xea;
      mi_3.ptr.isSet = true;
      mi_3.ptr._1_3_ = 1;
      piVar2 = Maybe<const_int_&>::orDefault
                         ((Maybe<const_int_&> *)&stack0xffffffffffffeb80,(int *)&mi_3);
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int_const&>&,int,int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x140,ERROR,
                 "\"failed: expected \" \"(234) == (m.orDefault(456))\", _kjCondition, 234, m.orDefault(456)"
                 ,(char (*) [45])"failed: expected (234) == (m.orDefault(456))",
                 (DebugComparison<int,_const_int_&> *)local_1648,&mi_3.ptr.field_1.value,piVar2);
      local_1655 = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)((long)&m_11.ptr + 4));
  Maybe<int>::Maybe();
  Maybe<int_const&>::Maybe<int,void>((Maybe<int_const&> *)&_kjCondition_76.result,&local_1668);
  DStack_16a8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<const_int_&> *)&_kjCondition_76.result);
  kj::_::DebugExpression<kj::Maybe<int_const&>&>::operator==
            ((DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_16a0,
             (DebugExpression<kj::Maybe<int_const&>&> *)&stack0xffffffffffffe958,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_16a0);
  if (!bVar1) {
    _v327._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_v327._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int_const&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x146,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<const_int_&>_&,_const_kj::None_&> *)local_16a0);
      _v327._7_1_ = false;
    }
  }
  piVar2 = kj::_::readMaybe<int_const>((Maybe<const_int_&> *)&_kjCondition_76.result);
  if (piVar2 != (int *)0x0) {
    m_13.ptr.field_1._23_1_ = kj::_::Debug::shouldLog(ERROR);
    while (m_13.ptr.field_1._23_1_ != '\0') {
      kj::_::Debug::log<int_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x148,ERROR,"v",piVar2);
      m_13.ptr.field_1._23_1_ = 0;
    }
  }
  Maybe<int>::~Maybe(&local_1668);
  Maybe<kj::String>::Maybe();
  pMVar11 = mv<kj::Maybe<kj::String>>((Maybe<kj::String> *)local_16e8);
  str<char_const(&)[4]>((String *)&_kjCondition_77.result,(kj *)0x31cf85,params);
  pSVar12 = Maybe<kj::String>::orDefault(pMVar11,(String *)&_kjCondition_77.result);
  String::String((String *)local_1708,pSVar12);
  String::~String((String *)&_kjCondition_77.result);
  DStack_1750 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x31cf85);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1748,
             (DebugExpression<char_const(&)[4]> *)&stack0xffffffffffffe8b0,(String *)local_1708);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1748);
  if (!bVar1) {
    _kjCondition_78._55_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_78._55_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[32],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x150,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (s)\", _kjCondition, \"foo\", s",
                 (char (*) [32])"failed: expected (\"foo\") == (s)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1748,
                 (char (*) [4])0x31cf85,(String *)local_1708);
      _kjCondition_78._55_1_ = 0;
    }
  }
  local_1798 = (char (*) [4])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x31cf85);
  pMVar11 = mv<kj::Maybe<kj::String>>((Maybe<kj::String> *)local_16e8);
  Maybe<kj::String>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__14,kj::String>
            ((String *)local_17b0,pMVar11,&local_17b1);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_1790,
             (DebugExpression<char_const(&)[4]> *)&local_1798,(String *)local_17b0);
  String::~String((String *)local_17b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1790);
  if (!bVar1) {
    local_17b2 = kj::_::Debug::shouldLog(ERROR);
    while (local_17b2 != false) {
      pMVar11 = mv<kj::Maybe<kj::String>>((Maybe<kj::String> *)local_16e8);
      Maybe<kj::String>::orDefault<kj::(anonymous_namespace)::TestCase64::run()::__15,kj::String>
                ((String *)&m_14.ptr.field_1.value,pMVar11,
                 (anon_class_1_0_00000001 *)&m_14.ptr.field_0x3);
      kj::_::Debug::
      log<char_const(&)[81],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x153,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (kj::mv(m).orDefault([] { return kj::str(\\\"foo\\\"); }))\", _kjCondition, \"foo\", kj::mv(m).orDefault([] { return kj::str(\"foo\"); })"
                 ,(char (*) [81])
                  "failed: expected (\"foo\") == (kj::mv(m).orDefault([] { return kj::str(\"foo\"); }))"
                 ,(DebugComparison<const_char_(&)[4],_kj::String> *)local_1790,
                 (char (*) [4])0x31cf85,(String *)&m_14.ptr.field_1.value);
      String::~String((String *)&m_14.ptr.field_1.value);
      local_17b2 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[4],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_1790);
  String::~String((String *)local_1708);
  Maybe<kj::String>::~Maybe((Maybe<kj::String> *)local_16e8);
  m2_1.ptr.isSet = true;
  m2_1.ptr._1_3_ = 0;
  this_00 = &m2_1.ptr.field_1;
  Maybe<kj::(anonymous_namespace)::ImplicitToInt>::Maybe
            ((Maybe<kj::(anonymous_namespace)::ImplicitToInt> *)this_00,(ImplicitToInt *)&m2_1);
  Maybe<unsigned_int>::Maybe<kj::(anonymous_namespace)::ImplicitToInt>
            (&m3,(Maybe<kj::(anonymous_namespace)::ImplicitToInt> *)this_00);
  other = mv<kj::Maybe<kj::(anonymous_namespace)::ImplicitToInt>>
                    ((Maybe<kj::(anonymous_namespace)::ImplicitToInt> *)&m2_1.ptr.field_1);
  Maybe<unsigned_int>::Maybe<kj::(anonymous_namespace)::ImplicitToInt>
            ((Maybe<unsigned_int> *)&_v347,other);
  puVar13 = kj::_::readMaybe<unsigned_int>(&m3);
  if (puVar13 == (uint *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)&_v352,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x15e);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_v352);
  }
  else {
    local_1830 = 0x7b;
    _kjCondition_79._32_8_ = puVar13;
    DStack_182c = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1830);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int_&> *)local_1828,&stack0xffffffffffffe7d4,
               (uint *)_kjCondition_79._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1828);
    if (!bVar1) {
      local_1831 = kj::_::Debug::shouldLog(ERROR);
      while (local_1831 != false) {
        local_1838 = 0x7b;
        kj::_::Debug::
        log<char_const(&)[30],kj::_::DebugComparison<int,unsigned_int&>&,int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x15c,ERROR,"\"failed: expected \" \"(123) == (v)\", _kjCondition, 123, v",
                   (char (*) [30])"failed: expected (123) == (v)",
                   (DebugComparison<int,_unsigned_int_&> *)local_1828,&local_1838,
                   (uint *)_kjCondition_79._32_8_);
        local_1831 = false;
      }
    }
  }
  puVar13 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&_v347);
  if (puVar13 == (uint *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_18b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x163);
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_18b0);
  }
  else {
    local_1890 = 0x7b;
    _kjCondition_80._32_8_ = puVar13;
    DStack_188c = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1890);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_int_&> *)local_1888,&stack0xffffffffffffe774,
               (uint *)_kjCondition_80._32_8_);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1888);
    if (!bVar1) {
      local_1891 = kj::_::Debug::shouldLog(ERROR);
      while (local_1891 != false) {
        local_1898 = 0x7b;
        kj::_::Debug::
        log<char_const(&)[30],kj::_::DebugComparison<int,unsigned_int&>&,int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                   ,0x161,ERROR,"\"failed: expected \" \"(123) == (v)\", _kjCondition, 123, v",
                   (char (*) [30])"failed: expected (123) == (v)",
                   (DebugComparison<int,_unsigned_int_&> *)local_1888,&local_1898,
                   (uint *)_kjCondition_80._32_8_);
        local_1891 = false;
      }
    }
  }
  Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&_v347);
  Maybe<unsigned_int>::~Maybe(&m3);
  Maybe<kj::(anonymous_namespace)::ImplicitToInt>::~Maybe
            ((Maybe<kj::(anonymous_namespace)::ImplicitToInt> *)&m2_1.ptr.field_1);
  Maybe<kj::(anonymous_namespace)::Immovable>::Maybe
            ((Maybe<kj::(anonymous_namespace)::Immovable> *)&_kjCondition_81.field_0x26);
  DStack_18e8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::(anonymous_namespace)::Immovable> *)
                           &_kjCondition_81.field_0x26);
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&> *
             )local_18e0,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&> *)
             &stack0xffffffffffffe718,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18e0);
  if (!bVar1) {
    _kjCondition_82._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_82._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x16a,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
                  *)local_18e0);
      _kjCondition_82._39_1_ = 0;
    }
  }
  Maybe<kj::(anonymous_namespace)::Immovable>::emplace<>
            ((Maybe<kj::(anonymous_namespace)::Immovable> *)&_kjCondition_81.field_0x26);
  DStack_1920 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::(anonymous_namespace)::Immovable> *)
                           &_kjCondition_81.field_0x26);
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&>::operator!=
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&> *
             )local_1918,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&> *)
             &stack0xffffffffffffe6e0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1918);
  if (!bVar1) {
    _kjCondition_83._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_83._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x16c,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
                  *)local_1918);
      _kjCondition_83._39_1_ = 0;
    }
  }
  Maybe<kj::(anonymous_namespace)::Immovable>::operator=
            ((Maybe<kj::(anonymous_namespace)::Immovable> *)&_kjCondition_81.field_0x26);
  _x = kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<kj::(anonymous_namespace)::Immovable> *)&_kjCondition_81.field_0x26);
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&> *
             )local_1950,(DebugExpression<kj::Maybe<kj::(anonymous_namespace)::Immovable>&> *)&x,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1950);
  if (!bVar1) {
    m_16.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)m_16.ptr._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x16e,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::Immovable>_&,_const_kj::None_&>
                  *)local_1950);
      m_16.ptr._7_1_ = false;
    }
  }
  Maybe<kj::(anonymous_namespace)::Immovable>::~Maybe
            ((Maybe<kj::(anonymous_namespace)::Immovable> *)&_kjCondition_81.field_0x26);
  CopyOrMove::CopyOrMove((CopyOrMove *)&m_16,0x7b);
  Maybe<kj::(anonymous_namespace)::CopyOrMove_&>::Maybe
            ((Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)&m2_2,(CopyOrMove *)&m_16);
  other_00 = mv<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove&>>
                       ((Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)&m2_2);
  Maybe<kj::(anonymous_namespace)::CopyOrMove>::Maybe<kj::(anonymous_namespace)::CopyOrMove>
            ((Maybe<kj::(anonymous_namespace)::CopyOrMove> *)&_kjCondition_84.result,other_00);
  DStack_19a0 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::(anonymous_namespace)::CopyOrMove_&> *)&m2_2);
  kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove_&>_&,_const_kj::None_&>
              *)local_1998,
             (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove&>&> *)
             &stack0xffffffffffffe660,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1998);
  if (!bVar1) {
    _kjCondition_85._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_85._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<kj::(anonymous_namespace)::CopyOrMove_&>_&,_const_kj::None_&>
                  *)local_1998);
      _kjCondition_85._39_1_ = 0;
    }
  }
  DStack_19d8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)&m_16);
  _kjCondition_86._36_4_ = 0x7b;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_19d0,
             (DebugExpression<int&> *)&stack0xffffffffffffe628,(int *)&_kjCondition_86.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_19d0);
  if (!bVar1) {
    _kjCondition_86._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_86._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x177,ERROR,"\"failed: expected \" \"x.i == 123\", _kjCondition",
                 (char (*) [28])"failed: expected x.i == 123",
                 (DebugComparison<int_&,_int> *)local_19d0);
      _kjCondition_86._35_1_ = 0;
    }
  }
  local_1a18 = kj::_::readMaybe<kj::(anonymous_namespace)::CopyOrMove>
                         ((Maybe<kj::(anonymous_namespace)::CopyOrMove> *)&_kjCondition_84.result);
  if (local_1a18 == (CopyOrMove *)0x0) {
    kj::_::Debug::Fault::Fault
              (&local_1a20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x178,FAILED,"m2 != nullptr","");
    kj::_::Debug::Fault::fatal(&local_1a20);
  }
  ppCVar14 = mv<kj::(anonymous_namespace)::CopyOrMove*>(&local_1a18);
  _kj_result_8 = (CopyOrMove *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&(*ppCVar14)->i);
  m_17.ptr.field_1.value = 0x7b;
  kj::_::DebugExpression<int&>::operator==
            ((DebugComparison<int_&,_int> *)local_1a08,(DebugExpression<int&> *)&_kj_result_8,
             &m_17.ptr.field_1.value);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a08);
  if (!bVar1) {
    m_17.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (m_17.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x178,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(m2).i == 123\", _kjCondition",
                 (char (*) [48])"failed: expected KJ_ASSERT_NONNULL(m2).i == 123",
                 (DebugComparison<int_&,_int> *)local_1a08);
      m_17.ptr._3_1_ = 0;
    }
  }
  Maybe<kj::(anonymous_namespace)::CopyOrMove>::~Maybe
            ((Maybe<kj::(anonymous_namespace)::CopyOrMove> *)&_kjCondition_84.result);
  _kjCondition_87._36_4_ = 0x7b;
  Maybe<int>::Maybe(&local_1a38,(int *)&_kjCondition_87.field_0x24);
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a38);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1a68,
             (DebugExpression<kj::Maybe<int>&> *)&n.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a68);
  if (!bVar1) {
    n.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (n.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x17e,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1a68);
      n.ptr._3_1_ = 0;
    }
  }
  pMVar3 = mv<kj::Maybe<int>>(&local_1a38);
  Maybe<int>::Maybe((Maybe<int> *)&_kjCondition_88.field_0x24,pMVar3);
  DStack_1ab0 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a38);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator==
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1aa8,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe550,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1aa8);
  if (!bVar1) {
    _kjCondition_89._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_89._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x181,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1aa8);
      _kjCondition_89._39_1_ = 0;
    }
  }
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<int> *)&_kjCondition_88.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1ae0,
             (DebugExpression<kj::Maybe<int>&> *)&m_18.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1ae0);
  if (!bVar1) {
    m_18.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (m_18.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x182,ERROR,"\"failed: expected \" \"n != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected n != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1ae0);
      m_18.ptr._3_1_ = 0;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_88.field_0x24);
  Maybe<int>::~Maybe(&local_1a38);
  _kjCondition_90.result = true;
  _kjCondition_90._33_3_ = 0;
  Maybe<int>::Maybe((Maybe<int> *)&_kjCondition_90.field_0x24,(int *)&_kjCondition_90.result);
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<int> *)&_kjCondition_90.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b20,
             (DebugExpression<kj::Maybe<int>&> *)&n_1.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b20);
  if (!bVar1) {
    n_1.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (n_1.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x188,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b20);
      n_1.ptr._3_1_ = 0;
    }
  }
  pMVar3 = mv<kj::Maybe<int>>((Maybe<int> *)&_kjCondition_90.field_0x24);
  Maybe<int>::Maybe((Maybe<int> *)&_kjCondition_91.field_0x24,pMVar3);
  DStack_1b68 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&_kjCondition_90.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator==
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b60,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe498,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b60);
  if (!bVar1) {
    _kjCondition_92._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_92._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x18b,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b60);
      _kjCondition_92._39_1_ = 0;
    }
  }
  _x_1 = kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (Maybe<int> *)&_kjCondition_91.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b98,
             (DebugExpression<kj::Maybe<int>&> *)&x_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b98);
  if (!bVar1) {
    m_19.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)m_19.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x18c,ERROR,"\"failed: expected \" \"n != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected n != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1b98);
      m_19.ptr._7_1_ = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_91.field_0x24);
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_90.field_0x24);
  m_19.ptr._0_4_ = 0x7b;
  Maybe<int_&>::Maybe((Maybe<int_&> *)&_kjCondition_93.result,(int *)&m_19);
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<int_&> *)&_kjCondition_93.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1bd8,
             (DebugExpression<kj::Maybe<int&>&> *)&n_2.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1bd8);
  if (!bVar1) {
    n_2.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (n_2.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x193,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1bd8);
      n_2.ptr._3_1_ = 0;
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>((Maybe<int_&> *)&_kjCondition_93.result);
  Maybe<int>::Maybe<int>((Maybe<int> *)&_kjCondition_94.field_0x24,pMVar8);
  DStack_1c20 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int_&> *)&_kjCondition_93.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator==
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1c18,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffe3e0,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c18);
  if (!bVar1) {
    _kjCondition_95._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_95._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x196,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1c18);
      _kjCondition_95._39_1_ = 0;
    }
  }
  _x_2 = kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (Maybe<int> *)&_kjCondition_94.field_0x24);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1c50,
             (DebugExpression<kj::Maybe<int>&> *)&x_2,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c50);
  if (!bVar1) {
    m_20.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)m_20.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x197,ERROR,"\"failed: expected \" \"n != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected n != kj::none",
                 (DebugComparison<kj::Maybe<int>_&,_const_kj::None_&> *)local_1c50);
      m_20.ptr._7_1_ = false;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_94.field_0x24);
  m_20.ptr._0_4_ = 0x7b;
  Maybe<int_&>::Maybe((Maybe<int_&> *)&_kjCondition_96.result,(int *)&m_20);
  DStack_1c98 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int_&> *)&_kjCondition_96.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1c90,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffe368,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c90);
  if (!bVar1) {
    n_3.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (n_3.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x19e,ERROR,"\"failed: expected \" \"m != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1c90);
      n_3.ptr._7_1_ = false;
    }
  }
  pMVar8 = mv<kj::Maybe<int&>>((Maybe<int_&> *)&_kjCondition_96.result);
  Maybe<int_&>::Maybe((Maybe<int_&> *)&_kjCondition_97.result,pMVar8);
  DStack_1cd8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int_&> *)&_kjCondition_96.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator==
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1cd0,
             (DebugExpression<kj::Maybe<int&>&> *)&stack0xffffffffffffe328,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1cd0);
  if (!bVar1) {
    _kjCondition_98._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_98._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1a1,ERROR,"\"failed: expected \" \"m == kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected m == kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1cd0);
      _kjCondition_98._39_1_ = 0;
    }
  }
  register0x00000000 =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (Maybe<int_&> *)&_kjCondition_97.result);
  kj::_::DebugExpression<kj::Maybe<int&>&>::operator!=
            ((DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1d08,
             (DebugExpression<kj::Maybe<int&>&> *)&m1.ptr.field_1,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d08);
  if (!bVar1) {
    m1.ptr._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while (m1.ptr._3_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::Maybe<int&>&,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1a2,ERROR,"\"failed: expected \" \"n != kj::none\", _kjCondition",
                 (char (*) [31])"failed: expected n != kj::none",
                 (DebugComparison<kj::Maybe<int_&>_&,_const_kj::None_&> *)local_1d08);
      m1.ptr._3_1_ = 0;
    }
  }
  m2_3.ptr.isSet = true;
  m2_3.ptr._1_3_ = 0;
  Maybe<int>::Maybe((Maybe<int> *)&m2_3.ptr.field_1,(int *)&m2_3);
  m3_1.ptr.isSet = true;
  m3_1.ptr._1_3_ = 0;
  Maybe<int>::Maybe((Maybe<int> *)&m3_1.ptr.field_1,(int *)&m3_1);
  m4.ptr.isSet = true;
  m4.ptr._1_3_ = 1;
  Maybe<int>::Maybe((Maybe<int> *)&m4.ptr.field_1,(int *)&m4);
  Maybe<int>::Maybe((Maybe<int> *)&m5.ptr.field_1);
  Maybe<int>::Maybe((Maybe<int> *)&_kjCondition_99.field_0x24);
  DStack_1d80 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&m2_3.ptr.field_1);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator==
            ((DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1d78,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe280,
             (Maybe<int> *)&m3_1.ptr.field_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d78);
  if (!bVar1) {
    _kjCondition_100._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_100._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<kj::Maybe<int>&,kj::Maybe<int>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1ac,ERROR,"\"failed: expected \" \"m1 == m2\", _kjCondition",
                 (char (*) [26])"failed: expected m1 == m2",
                 (DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1d78);
      _kjCondition_100._39_1_ = 0;
    }
  }
  DStack_1db8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&m2_3.ptr.field_1);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1db0,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe248,
             (Maybe<int> *)&m4.ptr.field_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1db0);
  if (!bVar1) {
    _kjCondition_101._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_101._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<kj::Maybe<int>&,kj::Maybe<int>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1ad,ERROR,"\"failed: expected \" \"m1 != m3\", _kjCondition",
                 (char (*) [26])"failed: expected m1 != m3",
                 (DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1db0);
      _kjCondition_101._39_1_ = 0;
    }
  }
  DStack_1df0 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&m2_3.ptr.field_1);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1de8,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe210,
             (Maybe<int> *)&m5.ptr.field_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1de8);
  if (!bVar1) {
    _kjCondition_102._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_102._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<kj::Maybe<int>&,kj::Maybe<int>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1ae,ERROR,"\"failed: expected \" \"m1 != m4\", _kjCondition",
                 (char (*) [26])"failed: expected m1 != m4",
                 (DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1de8);
      _kjCondition_102._39_1_ = 0;
    }
  }
  DStack_1e28 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&m5.ptr.field_1);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator==
            ((DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1e20,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe1d8,
             (Maybe<int> *)&_kjCondition_99.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e20);
  if (!bVar1) {
    _kjCondition_103._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_103._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<kj::Maybe<int>&,kj::Maybe<int>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1af,ERROR,"\"failed: expected \" \"m4 == m5\", _kjCondition",
                 (char (*) [26])"failed: expected m4 == m5",
                 (DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1e20);
      _kjCondition_103._39_1_ = 0;
    }
  }
  DStack_1e60 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<int> *)&m5.ptr.field_1);
  kj::_::DebugExpression<kj::Maybe<int>&>::operator!=
            ((DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1e58,
             (DebugExpression<kj::Maybe<int>&> *)&stack0xffffffffffffe1a0,
             (Maybe<int> *)&m2_3.ptr.field_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e58);
  if (!bVar1) {
    _kjCondition_104._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_104._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<kj::Maybe<int>&,kj::Maybe<int>&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1b0,ERROR,"\"failed: expected \" \"m4 != m1\", _kjCondition",
                 (char (*) [26])"failed: expected m4 != m1",
                 (DebugComparison<kj::Maybe<int>_&,_kj::Maybe<int>_&> *)local_1e58);
      _kjCondition_104._31_1_ = 0;
    }
  }
  Maybe<int>::~Maybe((Maybe<int> *)&_kjCondition_99.field_0x24);
  Maybe<int>::~Maybe((Maybe<int> *)&m5.ptr.field_1);
  Maybe<int>::~Maybe((Maybe<int> *)&m4.ptr.field_1);
  Maybe<int>::~Maybe((Maybe<int> *)&m3_1.ptr.field_1);
  Maybe<int>::~Maybe((Maybe<int> *)&m2_3.ptr.field_1);
  local_1e94[1] = 10;
  local_1e8c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_1e94 + 1);
  run::IntWrapper::IntWrapper(&local_1ea0,5);
  Maybe<IntWrapper>::Maybe((Maybe<IntWrapper> *)&stack0xffffffffffffe164,&local_1ea0);
  local_1e94[0] =
       kj::(anonymous_namespace)::TestCase64::run()::IntWrapper::twice(kj::Maybe<IntWrapper>_
                 ((Maybe<IntWrapper> *)&stack0xffffffffffffe164);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1e88,&local_1e8c,local_1e94);
  Maybe<IntWrapper>::~Maybe((Maybe<IntWrapper> *)&stack0xffffffffffffe164);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e88);
  if (!bVar1) {
    _kjCondition_105._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_105._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1bf,ERROR,
                 "\"failed: expected \" \"10 == IntWrapper::twice(Maybe<IntWrapper>(5))\", _kjCondition"
                 ,(char (*) [63])"failed: expected 10 == IntWrapper::twice(Maybe<IntWrapper>(5))",
                 (DebugComparison<int,_int> *)local_1e88);
      _kjCondition_105._31_1_ = 0;
    }
  }
  local_1ed4[1] = 10;
  local_1ecc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_1ed4 + 1);
  run::IntWrapper::IntWrapper(&local_1ee0,5);
  Maybe<IntWrapper>::Maybe((Maybe<IntWrapper> *)&stack0xffffffffffffe124,&local_1ee0);
  local_1ed4[0] =
       kj::(anonymous_namespace)::TestCase64::run()::IntWrapper::twice(kj::Maybe<IntWrapper>_
                 ((Maybe<IntWrapper> *)&stack0xffffffffffffe124);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1ec8,&local_1ecc,local_1ed4);
  Maybe<IntWrapper>::~Maybe((Maybe<IntWrapper> *)&stack0xffffffffffffe124);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1ec8);
  if (!bVar1) {
    _kjCondition_106._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_106._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[56],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1c0,ERROR,
                 "\"failed: expected \" \"10 == IntWrapper::twice(IntWrapper(5))\", _kjCondition",
                 (char (*) [56])"failed: expected 10 == IntWrapper::twice(IntWrapper(5))",
                 (DebugComparison<int,_int> *)local_1ec8);
      _kjCondition_106._31_1_ = 0;
    }
  }
  local_1f14[1] = 10;
  local_1f0c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_1f14 + 1);
  local_1f28 = 5;
  some<int>((kj *)&stack0xffffffffffffe0dc,&local_1f28);
  Maybe<IntWrapper>::Maybe<int>(&local_1f1c,(Maybe<int> *)&stack0xffffffffffffe0dc);
  local_1f14[0] =
       kj::(anonymous_namespace)::TestCase64::run()::IntWrapper::twice(kj::Maybe<IntWrapper>_
                 (&local_1f1c);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_1f08,&local_1f0c,local_1f14);
  Maybe<IntWrapper>::~Maybe(&local_1f1c);
  Maybe<int>::~Maybe((Maybe<int> *)&stack0xffffffffffffe0dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f08);
  if (!bVar1) {
    local_1f29 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f29 != false) {
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x1c3,ERROR,
                 "\"failed: expected \" \"10 == IntWrapper::twice(kj::some(5))\", _kjCondition",
                 (char (*) [54])"failed: expected 10 == IntWrapper::twice(kj::some(5))",
                 (DebugComparison<int,_int> *)local_1f08);
      local_1f29 = false;
    }
  }
  return;
}

Assistant:

TEST(Common, Maybe) {
  {
    Maybe<int> m = 123;
    EXPECT_FALSE(m == kj::none);
    EXPECT_TRUE(m != kj::none);
    KJ_IF_SOME(v, m) {
      EXPECT_EQ(123, v);
    } else {
      ADD_FAILURE();
    }
    KJ_IF_SOME(v, mv(m)) {
      EXPECT_EQ(123, v);
    } else {
      ADD_FAILURE();
    }